

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  uint uVar72;
  uint uVar73;
  undefined1 (*pauVar74) [32];
  uint uVar75;
  uint uVar76;
  long lVar77;
  ulong uVar78;
  ulong uVar79;
  int iVar80;
  ulong uVar81;
  float fVar82;
  float fVar110;
  float fVar111;
  vint4 bi_2;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar112;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar86 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar109 [32];
  undefined1 extraout_var [60];
  float fVar113;
  undefined8 extraout_XMM1_Qa;
  float fVar138;
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar135 [32];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  vint4 ai;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar144 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar156;
  float fVar175;
  float fVar176;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar177;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar178;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  vint4 bi;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar193;
  float fVar196;
  undefined1 auVar187 [28];
  float fVar194;
  float fVar195;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar197;
  float fVar198;
  float fVar209;
  float fVar211;
  vint4 ai_2;
  undefined1 auVar199 [16];
  float fVar213;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar210;
  float fVar212;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar206 [32];
  float fVar218;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar231;
  float fVar234;
  undefined1 auVar222 [16];
  float fVar237;
  float fVar239;
  float fVar241;
  float fVar243;
  undefined1 auVar225 [32];
  float fVar232;
  float fVar235;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar233;
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar245;
  float fVar257;
  float fVar260;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar246;
  float fVar247;
  undefined1 auVar250 [16];
  float fVar258;
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  undefined1 auVar251 [32];
  float fVar263;
  float fVar267;
  float fVar271;
  float fVar275;
  float fVar279;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar282;
  float fVar283;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  vint4 ai_1;
  undefined1 auVar284 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  float s;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar305;
  float fVar308;
  undefined1 auVar303 [16];
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar304 [32];
  float fVar326;
  float fVar334;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar333;
  undefined1 auVar332 [64];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar340;
  undefined1 auVar338 [32];
  undefined1 auVar339 [64];
  float fVar341;
  float fVar342;
  float fVar347;
  float fVar349;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar345 [32];
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar369;
  float fVar371;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar373;
  float fVar374;
  float fVar376;
  float fVar379;
  float fVar381;
  undefined1 auVar364 [32];
  float fVar370;
  float fVar372;
  float fVar375;
  float fVar377;
  float fVar380;
  float fVar382;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar378;
  float fVar383;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c28;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 (*local_9a8) [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  ulong local_900;
  undefined1 auStack_8f8 [24];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined4 uStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  RTCHitN local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  uint local_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 auStack_6a0 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar136 [64];
  undefined1 auVar346 [64];
  
  PVar3 = prim[1];
  uVar81 = (ulong)(byte)PVar3;
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar115 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar115 = vinsertps_avx(auVar115,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar197 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar89._0_4_ = fVar197 * auVar8._0_4_;
  auVar89._4_4_ = fVar197 * auVar8._4_4_;
  auVar89._8_4_ = fVar197 * auVar8._8_4_;
  auVar89._12_4_ = fVar197 * auVar8._12_4_;
  auVar248._0_4_ = fVar197 * auVar115._0_4_;
  auVar248._4_4_ = fVar197 * auVar115._4_4_;
  auVar248._8_4_ = fVar197 * auVar115._8_4_;
  auVar248._12_4_ = fVar197 * auVar115._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar81 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar79 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar81 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar79 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar88 = vshufps_avx(auVar248,auVar248,0);
  auVar94 = vshufps_avx(auVar248,auVar248,0x55);
  auVar141 = vshufps_avx(auVar248,auVar248,0xaa);
  fVar197 = auVar141._0_4_;
  fVar156 = auVar141._4_4_;
  fVar209 = auVar141._8_4_;
  fVar175 = auVar141._12_4_;
  fVar219 = auVar94._0_4_;
  fVar231 = auVar94._4_4_;
  fVar234 = auVar94._8_4_;
  fVar237 = auVar94._12_4_;
  fVar211 = auVar88._0_4_;
  fVar176 = auVar88._4_4_;
  fVar213 = auVar88._8_4_;
  fVar177 = auVar88._12_4_;
  auVar343._0_4_ = fVar211 * auVar8._0_4_ + fVar219 * auVar115._0_4_ + fVar197 * auVar10._0_4_;
  auVar343._4_4_ = fVar176 * auVar8._4_4_ + fVar231 * auVar115._4_4_ + fVar156 * auVar10._4_4_;
  auVar343._8_4_ = fVar213 * auVar8._8_4_ + fVar234 * auVar115._8_4_ + fVar209 * auVar10._8_4_;
  auVar343._12_4_ = fVar177 * auVar8._12_4_ + fVar237 * auVar115._12_4_ + fVar175 * auVar10._12_4_;
  auVar362._0_4_ = fVar211 * auVar11._0_4_ + fVar219 * auVar167._0_4_ + auVar12._0_4_ * fVar197;
  auVar362._4_4_ = fVar176 * auVar11._4_4_ + fVar231 * auVar167._4_4_ + auVar12._4_4_ * fVar156;
  auVar362._8_4_ = fVar213 * auVar11._8_4_ + fVar234 * auVar167._8_4_ + auVar12._8_4_ * fVar209;
  auVar362._12_4_ = fVar177 * auVar11._12_4_ + fVar237 * auVar167._12_4_ + auVar12._12_4_ * fVar175;
  auVar249._0_4_ = fVar211 * auVar83._0_4_ + fVar219 * auVar84._0_4_ + auVar114._0_4_ * fVar197;
  auVar249._4_4_ = fVar176 * auVar83._4_4_ + fVar231 * auVar84._4_4_ + auVar114._4_4_ * fVar156;
  auVar249._8_4_ = fVar213 * auVar83._8_4_ + fVar234 * auVar84._8_4_ + auVar114._8_4_ * fVar209;
  auVar249._12_4_ = fVar177 * auVar83._12_4_ + fVar237 * auVar84._12_4_ + auVar114._12_4_ * fVar175;
  auVar88 = vshufps_avx(auVar89,auVar89,0);
  auVar94 = vshufps_avx(auVar89,auVar89,0x55);
  auVar141 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar197 = auVar141._0_4_;
  fVar156 = auVar141._4_4_;
  fVar209 = auVar141._8_4_;
  fVar175 = auVar141._12_4_;
  fVar219 = auVar94._0_4_;
  fVar231 = auVar94._4_4_;
  fVar234 = auVar94._8_4_;
  fVar237 = auVar94._12_4_;
  fVar211 = auVar88._0_4_;
  fVar176 = auVar88._4_4_;
  fVar213 = auVar88._8_4_;
  fVar177 = auVar88._12_4_;
  auVar91._0_4_ = fVar211 * auVar8._0_4_ + fVar219 * auVar115._0_4_ + fVar197 * auVar10._0_4_;
  auVar91._4_4_ = fVar176 * auVar8._4_4_ + fVar231 * auVar115._4_4_ + fVar156 * auVar10._4_4_;
  auVar91._8_4_ = fVar213 * auVar8._8_4_ + fVar234 * auVar115._8_4_ + fVar209 * auVar10._8_4_;
  auVar91._12_4_ = fVar177 * auVar8._12_4_ + fVar237 * auVar115._12_4_ + fVar175 * auVar10._12_4_;
  auVar94._0_4_ = fVar211 * auVar11._0_4_ + auVar12._0_4_ * fVar197 + fVar219 * auVar167._0_4_;
  auVar94._4_4_ = fVar176 * auVar11._4_4_ + auVar12._4_4_ * fVar156 + fVar231 * auVar167._4_4_;
  auVar94._8_4_ = fVar213 * auVar11._8_4_ + auVar12._8_4_ * fVar209 + fVar234 * auVar167._8_4_;
  auVar94._12_4_ = fVar177 * auVar11._12_4_ + auVar12._12_4_ * fVar175 + fVar237 * auVar167._12_4_;
  auVar88._0_4_ = fVar211 * auVar83._0_4_ + fVar219 * auVar84._0_4_ + auVar114._0_4_ * fVar197;
  auVar88._4_4_ = fVar176 * auVar83._4_4_ + fVar231 * auVar84._4_4_ + auVar114._4_4_ * fVar156;
  auVar88._8_4_ = fVar213 * auVar83._8_4_ + fVar234 * auVar84._8_4_ + auVar114._8_4_ * fVar209;
  auVar88._12_4_ = fVar177 * auVar83._12_4_ + fVar237 * auVar84._12_4_ + auVar114._12_4_ * fVar175;
  auVar222._8_4_ = 0x7fffffff;
  auVar222._0_8_ = 0x7fffffff7fffffff;
  auVar222._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar343,auVar222);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar157,1);
  auVar115 = vblendvps_avx(auVar343,auVar157,auVar8);
  auVar8 = vandps_avx(auVar362,auVar222);
  auVar8 = vcmpps_avx(auVar8,auVar157,1);
  auVar10 = vblendvps_avx(auVar362,auVar157,auVar8);
  auVar8 = vandps_avx(auVar249,auVar222);
  auVar8 = vcmpps_avx(auVar8,auVar157,1);
  auVar8 = vblendvps_avx(auVar249,auVar157,auVar8);
  auVar11 = vrcpps_avx(auVar115);
  fVar219 = auVar11._0_4_;
  auVar141._0_4_ = fVar219 * auVar115._0_4_;
  fVar231 = auVar11._4_4_;
  auVar141._4_4_ = fVar231 * auVar115._4_4_;
  fVar234 = auVar11._8_4_;
  auVar141._8_4_ = fVar234 * auVar115._8_4_;
  fVar237 = auVar11._12_4_;
  auVar141._12_4_ = fVar237 * auVar115._12_4_;
  auVar250._8_4_ = 0x3f800000;
  auVar250._0_8_ = 0x3f8000003f800000;
  auVar250._12_4_ = 0x3f800000;
  auVar115 = vsubps_avx(auVar250,auVar141);
  fVar219 = fVar219 + fVar219 * auVar115._0_4_;
  fVar231 = fVar231 + fVar231 * auVar115._4_4_;
  fVar234 = fVar234 + fVar234 * auVar115._8_4_;
  fVar237 = fVar237 + fVar237 * auVar115._12_4_;
  auVar115 = vrcpps_avx(auVar10);
  fVar197 = auVar115._0_4_;
  auVar199._0_4_ = fVar197 * auVar10._0_4_;
  fVar209 = auVar115._4_4_;
  auVar199._4_4_ = fVar209 * auVar10._4_4_;
  fVar211 = auVar115._8_4_;
  auVar199._8_4_ = fVar211 * auVar10._8_4_;
  fVar213 = auVar115._12_4_;
  auVar199._12_4_ = fVar213 * auVar10._12_4_;
  auVar115 = vsubps_avx(auVar250,auVar199);
  fVar197 = fVar197 + fVar197 * auVar115._0_4_;
  fVar209 = fVar209 + fVar209 * auVar115._4_4_;
  fVar211 = fVar211 + fVar211 * auVar115._8_4_;
  fVar213 = fVar213 + fVar213 * auVar115._12_4_;
  auVar115 = vrcpps_avx(auVar8);
  fVar156 = auVar115._0_4_;
  auVar158._0_4_ = fVar156 * auVar8._0_4_;
  fVar175 = auVar115._4_4_;
  auVar158._4_4_ = fVar175 * auVar8._4_4_;
  fVar176 = auVar115._8_4_;
  auVar158._8_4_ = fVar176 * auVar8._8_4_;
  fVar177 = auVar115._12_4_;
  auVar158._12_4_ = fVar177 * auVar8._12_4_;
  auVar8 = vsubps_avx(auVar250,auVar158);
  fVar156 = fVar156 + fVar156 * auVar8._0_4_;
  fVar175 = fVar175 + fVar175 * auVar8._4_4_;
  fVar176 = fVar176 + fVar176 * auVar8._8_4_;
  fVar177 = fVar177 + fVar177 * auVar8._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar91);
  auVar122._0_4_ = fVar219 * auVar8._0_4_;
  auVar122._4_4_ = fVar231 * auVar8._4_4_;
  auVar122._8_4_ = fVar234 * auVar8._8_4_;
  auVar122._12_4_ = fVar237 * auVar8._12_4_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar115);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar91);
  auVar96._0_4_ = fVar219 * auVar8._0_4_;
  auVar96._4_4_ = fVar231 * auVar8._4_4_;
  auVar96._8_4_ = fVar234 * auVar8._8_4_;
  auVar96._12_4_ = fVar237 * auVar8._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar115 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar81 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar94);
  auVar284._0_4_ = auVar8._0_4_ * fVar197;
  auVar284._4_4_ = auVar8._4_4_ * fVar209;
  auVar284._8_4_ = auVar8._8_4_ * fVar211;
  auVar284._12_4_ = auVar8._12_4_ * fVar213;
  auVar8 = vcvtdq2ps_avx(auVar115);
  auVar8 = vsubps_avx(auVar8,auVar94);
  auVar114._0_4_ = fVar197 * auVar8._0_4_;
  auVar114._4_4_ = fVar209 * auVar8._4_4_;
  auVar114._8_4_ = fVar211 * auVar8._8_4_;
  auVar114._12_4_ = fVar213 * auVar8._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar79 + uVar81 + 6);
  auVar8 = vpmovsxwd_avx(auVar167);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar88);
  auVar200._0_4_ = auVar8._0_4_ * fVar156;
  auVar200._4_4_ = auVar8._4_4_ * fVar175;
  auVar200._8_4_ = auVar8._8_4_ * fVar176;
  auVar200._12_4_ = auVar8._12_4_ * fVar177;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar88);
  auVar83._0_4_ = auVar8._0_4_ * fVar156;
  auVar83._4_4_ = auVar8._4_4_ * fVar175;
  auVar83._8_4_ = auVar8._8_4_ * fVar176;
  auVar83._12_4_ = auVar8._12_4_ * fVar177;
  auVar8 = vpminsd_avx(auVar122,auVar96);
  auVar115 = vpminsd_avx(auVar284,auVar114);
  auVar8 = vmaxps_avx(auVar8,auVar115);
  auVar115 = vpminsd_avx(auVar200,auVar83);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._4_4_ = uVar1;
  auVar303._0_4_ = uVar1;
  auVar303._8_4_ = uVar1;
  auVar303._12_4_ = uVar1;
  auVar115 = vmaxps_avx(auVar115,auVar303);
  auVar8 = vmaxps_avx(auVar8,auVar115);
  local_520._0_4_ = auVar8._0_4_ * 0.99999964;
  local_520._4_4_ = auVar8._4_4_ * 0.99999964;
  local_520._8_4_ = auVar8._8_4_ * 0.99999964;
  local_520._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar122,auVar96);
  auVar115 = vpmaxsd_avx(auVar284,auVar114);
  auVar8 = vminps_avx(auVar8,auVar115);
  auVar115 = vpmaxsd_avx(auVar200,auVar83);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar116._4_4_ = uVar1;
  auVar116._0_4_ = uVar1;
  auVar116._8_4_ = uVar1;
  auVar116._12_4_ = uVar1;
  auVar115 = vminps_avx(auVar115,auVar116);
  auVar8 = vminps_avx(auVar8,auVar115);
  auVar84._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar84._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar84._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar84._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar8 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar115 = vpcmpgtd_avx(auVar8,_DAT_01f7fcf0);
  auVar8 = vcmpps_avx(local_520,auVar84,2);
  auVar8 = vandps_avx(auVar8,auVar115);
  uVar72 = vmovmskps_avx(auVar8);
  if (uVar72 == 0) {
    return;
  }
  uVar72 = uVar72 & 0xff;
  auVar99._16_16_ = mm_lookupmask_ps._240_16_;
  auVar99._0_16_ = mm_lookupmask_ps._240_16_;
  local_4a0 = vblendps_avx(auVar99,ZEXT832(0) << 0x20,0x80);
  local_9a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_888 = prim;
LAB_00e73de1:
  uVar79 = (ulong)uVar72;
  lVar77 = 0;
  if (uVar79 != 0) {
    for (; (uVar72 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
    }
  }
  uVar79 = uVar79 - 1 & uVar79;
  uVar72 = *(uint *)(local_888 + 2);
  local_900 = (ulong)*(uint *)(local_888 + lVar77 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar72].ptr;
  uVar81 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_900);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar8 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar81);
  auVar115 = *(undefined1 (*) [16])(lVar6 + (uVar81 + 1) * (long)p_Var5);
  lVar7 = 0;
  if (uVar79 != 0) {
    for (; (uVar79 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  if (((uVar79 != 0) && (uVar78 = uVar79 - 1 & uVar79, uVar78 != 0)) && (lVar7 = 0, uVar78 != 0)) {
    for (; (uVar78 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar11 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar197 = *(float *)(ray + k * 4 + 0x40);
  auVar335._4_4_ = fVar197;
  auVar335._0_4_ = fVar197;
  auVar335._8_4_ = fVar197;
  auVar335._12_4_ = fVar197;
  fStack_7d0 = fVar197;
  _local_7e0 = auVar335;
  fStack_7cc = fVar197;
  fStack_7c8 = fVar197;
  fStack_7c4 = fVar197;
  fVar156 = *(float *)(ray + k * 4 + 0x50);
  auVar344._4_4_ = fVar156;
  auVar344._0_4_ = fVar156;
  auVar344._8_4_ = fVar156;
  auVar344._12_4_ = fVar156;
  fStack_7f0 = fVar156;
  _local_800 = auVar344;
  fStack_7ec = fVar156;
  fStack_7e8 = fVar156;
  fStack_7e4 = fVar156;
  auVar346 = ZEXT3264(_local_800);
  auVar10 = vunpcklps_avx(auVar335,auVar344);
  fVar209 = *(float *)(ray + k * 4 + 0x60);
  auVar363._4_4_ = fVar209;
  auVar363._0_4_ = fVar209;
  auVar363._8_4_ = fVar209;
  auVar363._12_4_ = fVar209;
  fStack_7b0 = fVar209;
  _local_7c0 = auVar363;
  fStack_7ac = fVar209;
  fStack_7a8 = fVar209;
  uStack_7a4 = fVar209;
  _local_950 = vinsertps_avx(auVar10,auVar363,0x28);
  auVar85._0_4_ = (auVar8._0_4_ + auVar115._0_4_) * 0.5;
  auVar85._4_4_ = (auVar8._4_4_ + auVar115._4_4_) * 0.5;
  auVar85._8_4_ = (auVar8._8_4_ + auVar115._8_4_) * 0.5;
  auVar85._12_4_ = (auVar8._12_4_ + auVar115._12_4_) * 0.5;
  auVar10 = vsubps_avx(auVar85,auVar11);
  auVar10 = vdpps_avx(auVar10,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar332 = ZEXT1664(local_960);
  auVar167 = vrcpss_avx(local_960,local_960);
  fVar175 = auVar10._0_4_ * auVar167._0_4_ * (2.0 - local_960._0_4_ * auVar167._0_4_);
  auVar167 = vshufps_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),0);
  auVar201._0_4_ = auVar11._0_4_ + local_950._0_4_ * auVar167._0_4_;
  auVar201._4_4_ = auVar11._4_4_ + local_950._4_4_ * auVar167._4_4_;
  auVar201._8_4_ = auVar11._8_4_ + local_950._8_4_ * auVar167._8_4_;
  auVar201._12_4_ = auVar11._12_4_ + local_950._12_4_ * auVar167._12_4_;
  auVar10 = vblendps_avx(auVar201,_DAT_01f7aa10,8);
  auVar11 = vsubps_avx(auVar8,auVar10);
  auVar12 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar81 + 2) * (long)p_Var5),auVar10);
  auVar83 = vsubps_avx(auVar115,auVar10);
  auVar285 = ZEXT1664(auVar83);
  auVar84 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar81 + 3) * (long)p_Var5),auVar10);
  auVar8 = vshufps_avx(auVar11,auVar11,0);
  register0x00001250 = auVar8;
  _local_380 = auVar8;
  auVar8 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001250 = auVar8;
  _local_1e0 = auVar8;
  auVar8 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001250 = auVar8;
  _local_200 = auVar8;
  auVar8 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar8;
  _local_220 = auVar8;
  auVar8 = vshufps_avx(auVar83,auVar83,0);
  register0x00001290 = auVar8;
  _local_3a0 = auVar8;
  auVar8 = vshufps_avx(auVar83,auVar83,0x55);
  register0x00001290 = auVar8;
  _local_3c0 = auVar8;
  auVar8 = vshufps_avx(auVar83,auVar83,0xaa);
  register0x00001290 = auVar8;
  _local_3e0 = auVar8;
  auVar8 = vshufps_avx(auVar83,auVar83,0xff);
  register0x00001290 = auVar8;
  _local_240 = auVar8;
  auVar8 = vshufps_avx(auVar12,auVar12,0);
  register0x00001290 = auVar8;
  _local_400 = auVar8;
  auVar8 = vshufps_avx(auVar12,auVar12,0x55);
  register0x00001290 = auVar8;
  _local_420 = auVar8;
  auVar8 = vshufps_avx(auVar12,auVar12,0xaa);
  register0x00001290 = auVar8;
  _local_440 = auVar8;
  auVar8 = vshufps_avx(auVar12,auVar12,0xff);
  register0x00001290 = auVar8;
  _local_460 = auVar8;
  auVar8 = vshufps_avx(auVar84,auVar84,0);
  register0x000014d0 = auVar8;
  _local_820 = auVar8;
  auVar339 = ZEXT3264(_local_820);
  auVar8 = vshufps_avx(auVar84,auVar84,0x55);
  auVar115 = vshufps_avx(auVar84,auVar84,0xaa);
  register0x00001290 = auVar115;
  _local_480 = auVar115;
  auVar115 = vshufps_avx(auVar84,auVar84,0xff);
  register0x00001290 = auVar115;
  _local_260 = auVar115;
  auVar115 = ZEXT416((uint)(fVar197 * fVar197 + fVar156 * fVar156 + fVar209 * fVar209));
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  local_280._16_16_ = auVar115;
  local_280._0_16_ = auVar115;
  fVar197 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)fVar175);
  auVar115 = vshufps_avx(ZEXT416((uint)(fVar197 - fVar175)),ZEXT416((uint)(fVar197 - fVar175)),0);
  local_2a0._16_16_ = auVar115;
  local_2a0._0_16_ = auVar115;
  local_730 = vpshufd_avx(ZEXT416(uVar72),0);
  local_740 = vpshufd_avx(ZEXT416(*(uint *)(local_888 + lVar77 * 4 + 6)),0);
  register0x00001210 = auVar167;
  _local_9e0 = auVar167;
  local_c28 = 1;
  uVar81 = 0;
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_280,auVar100);
  auVar115 = vsqrtss_avx(local_960,local_960);
  auVar10 = vsqrtss_avx(local_960,local_960);
  local_510 = ZEXT816(0x3f80000000000000);
  do {
    auVar188._8_4_ = 0x3f800000;
    auVar188._0_8_ = 0x3f8000003f800000;
    auVar188._12_4_ = 0x3f800000;
    auVar188._16_4_ = 0x3f800000;
    auVar188._20_4_ = 0x3f800000;
    iVar80 = (int)uVar81;
    auVar188._24_4_ = 0x3f800000;
    auVar188._28_4_ = 0x3f800000;
    auVar167 = vmovshdup_avx(local_510);
    auVar88 = vsubps_avx(auVar167,local_510);
    auVar167 = vshufps_avx(local_510,local_510,0);
    local_780._16_16_ = auVar167;
    local_780._0_16_ = auVar167;
    auVar114 = vshufps_avx(auVar88,auVar88,0);
    local_7a0._16_16_ = auVar114;
    local_7a0._0_16_ = auVar114;
    fVar113 = auVar114._0_4_;
    fVar137 = auVar114._4_4_;
    fVar138 = auVar114._8_4_;
    fVar139 = auVar114._12_4_;
    fVar82 = auVar167._0_4_;
    auVar170._0_4_ = fVar82 + fVar113 * 0.0;
    fVar110 = auVar167._4_4_;
    auVar170._4_4_ = fVar110 + fVar137 * 0.14285715;
    fVar111 = auVar167._8_4_;
    auVar170._8_4_ = fVar111 + fVar138 * 0.2857143;
    fVar112 = auVar167._12_4_;
    auVar170._12_4_ = fVar112 + fVar139 * 0.42857146;
    auVar170._16_4_ = fVar82 + fVar113 * 0.5714286;
    auVar170._20_4_ = fVar110 + fVar137 * 0.71428573;
    auVar170._24_4_ = fVar111 + fVar138 * 0.8571429;
    auVar170._28_4_ = fVar112 + fVar139;
    auVar99 = vsubps_avx(auVar188,auVar170);
    local_9a0._4_4_ = auVar170._4_4_ * auVar170._4_4_;
    local_9a0._0_4_ = auVar170._0_4_ * auVar170._0_4_;
    fStack_998 = auVar170._8_4_ * auVar170._8_4_;
    fStack_994 = auVar170._12_4_ * auVar170._12_4_;
    fStack_990 = auVar170._16_4_ * auVar170._16_4_;
    fStack_98c = auVar170._20_4_ * auVar170._20_4_;
    fStack_988 = auVar170._24_4_ * auVar170._24_4_;
    fStack_984 = fVar112;
    fVar231 = auVar170._0_4_ * 3.0;
    fVar234 = auVar170._4_4_ * 3.0;
    fVar237 = auVar170._8_4_ * 3.0;
    fVar193 = auVar170._12_4_ * 3.0;
    fVar194 = auVar170._16_4_ * 3.0;
    fVar195 = auVar170._20_4_ * 3.0;
    fVar196 = auVar170._24_4_ * 3.0;
    fVar156 = auVar99._0_4_;
    auVar286._0_4_ = fVar156 * fVar156;
    fVar209 = auVar99._4_4_;
    auVar286._4_4_ = fVar209 * fVar209;
    fVar175 = auVar99._8_4_;
    auVar286._8_4_ = fVar175 * fVar175;
    fVar211 = auVar99._12_4_;
    auVar286._12_4_ = fVar211 * fVar211;
    fVar176 = auVar99._16_4_;
    auVar286._16_4_ = fVar176 * fVar176;
    fVar213 = auVar99._20_4_;
    auVar286._20_4_ = fVar213 * fVar213;
    fVar177 = auVar99._24_4_;
    auVar286._28_36_ = auVar285._28_36_;
    auVar286._24_4_ = fVar177 * fVar177;
    fVar219 = auVar99._28_4_;
    fVar198 = (auVar286._0_4_ * (fVar156 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar210 = (auVar286._4_4_ * (fVar209 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar212 = (auVar286._8_4_ * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar214 = (auVar286._12_4_ * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar215 = (auVar286._16_4_ * (fVar176 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar216 = (auVar286._20_4_ * (fVar213 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar217 = (auVar286._24_4_ * (fVar177 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar300 = -fVar156 * auVar170._0_4_ * auVar170._0_4_ * 0.5;
    fVar305 = -fVar209 * auVar170._4_4_ * auVar170._4_4_ * 0.5;
    fVar308 = -fVar175 * auVar170._8_4_ * auVar170._8_4_ * 0.5;
    fVar311 = -fVar211 * auVar170._12_4_ * auVar170._12_4_ * 0.5;
    fVar314 = -fVar176 * auVar170._16_4_ * auVar170._16_4_ * 0.5;
    fVar317 = -fVar213 * auVar170._20_4_ * auVar170._20_4_ * 0.5;
    fVar320 = -fVar177 * auVar170._24_4_ * auVar170._24_4_ * 0.5;
    fVar359 = auVar8._0_4_;
    fVar378 = auVar8._4_4_;
    fVar383 = auVar8._8_4_;
    fVar373 = auVar8._12_4_;
    fVar334 = auVar332._28_4_ + fVar373;
    fVar340 = auVar339._28_4_ + fVar373;
    fVar360 = (auVar170._0_4_ * auVar170._0_4_ * (fVar231 + -5.0) + 2.0) * 0.5;
    fVar369 = (auVar170._4_4_ * auVar170._4_4_ * (fVar234 + -5.0) + 2.0) * 0.5;
    fVar371 = (auVar170._8_4_ * auVar170._8_4_ * (fVar237 + -5.0) + 2.0) * 0.5;
    fVar374 = (auVar170._12_4_ * auVar170._12_4_ * (fVar193 + -5.0) + 2.0) * 0.5;
    fVar376 = (auVar170._16_4_ * auVar170._16_4_ * (fVar194 + -5.0) + 2.0) * 0.5;
    fVar379 = (auVar170._20_4_ * auVar170._20_4_ * (fVar195 + -5.0) + 2.0) * 0.5;
    fVar381 = (auVar170._24_4_ * auVar170._24_4_ * (fVar196 + -5.0) + 2.0) * 0.5;
    fVar341 = -auVar170._0_4_ * fVar156 * fVar156 * 0.5;
    fVar347 = -auVar170._4_4_ * fVar209 * fVar209 * 0.5;
    fVar349 = -auVar170._8_4_ * fVar175 * fVar175 * 0.5;
    fVar351 = -auVar170._12_4_ * fVar211 * fVar211 * 0.5;
    fVar353 = -auVar170._16_4_ * fVar176 * fVar176 * 0.5;
    fVar355 = -auVar170._20_4_ * fVar213 * fVar213 * 0.5;
    fVar357 = -auVar170._24_4_ * fVar177 * fVar177 * 0.5;
    fVar301 = fVar341 * (float)local_380._0_4_ +
              fVar360 * (float)local_3a0._0_4_ +
              auVar339._0_4_ * fVar300 + fVar198 * (float)local_400._0_4_;
    fVar306 = fVar347 * (float)local_380._4_4_ +
              fVar369 * (float)local_3a0._4_4_ +
              auVar339._4_4_ * fVar305 + fVar210 * (float)local_400._4_4_;
    fVar309 = fVar349 * fStack_378 +
              fVar371 * fStack_398 + auVar339._8_4_ * fVar308 + fVar212 * fStack_3f8;
    fVar312 = fVar351 * fStack_374 +
              fVar374 * fStack_394 + auVar339._12_4_ * fVar311 + fVar214 * fStack_3f4;
    fVar315 = fVar353 * fStack_370 +
              fVar376 * fStack_390 + auVar339._16_4_ * fVar314 + fVar215 * fStack_3f0;
    fVar318 = fVar355 * fStack_36c +
              fVar379 * fStack_38c + auVar339._20_4_ * fVar317 + fVar216 * fStack_3ec;
    fVar321 = fVar357 * fStack_368 +
              fVar381 * fStack_388 + auVar339._24_4_ * fVar320 + fVar217 * fStack_3e8;
    fVar324 = fVar373 + 2.0 + -fVar219 + fVar334;
    fVar302 = (float)local_1e0._0_4_ * fVar341 +
              fVar360 * (float)local_3c0._0_4_ +
              fVar359 * fVar300 + fVar198 * (float)local_420._0_4_;
    fVar307 = (float)local_1e0._4_4_ * fVar347 +
              fVar369 * (float)local_3c0._4_4_ +
              fVar378 * fVar305 + fVar210 * (float)local_420._4_4_;
    fVar310 = fStack_1d8 * fVar349 + fVar371 * fStack_3b8 + fVar383 * fVar308 + fVar212 * fStack_418
    ;
    fVar313 = fStack_1d4 * fVar351 + fVar374 * fStack_3b4 + fVar373 * fVar311 + fVar214 * fStack_414
    ;
    fVar316 = fStack_1d0 * fVar353 + fVar376 * fStack_3b0 + fVar359 * fVar314 + fVar215 * fStack_410
    ;
    fVar319 = fStack_1cc * fVar355 + fVar379 * fStack_3ac + fVar378 * fVar317 + fVar216 * fStack_40c
    ;
    fVar322 = fStack_1c8 * fVar357 + fVar381 * fStack_3a8 + fVar383 * fVar320 + fVar217 * fStack_408
    ;
    fVar325 = fVar324 + fVar334 + fVar340;
    local_920 = (float)local_200._0_4_ * fVar341 +
                fVar360 * (float)local_3e0._0_4_ +
                fVar300 * (float)local_480._0_4_ + fVar198 * (float)local_440._0_4_;
    fStack_91c = (float)local_200._4_4_ * fVar347 +
                 fVar369 * (float)local_3e0._4_4_ +
                 fVar305 * (float)local_480._4_4_ + fVar210 * (float)local_440._4_4_;
    fStack_918 = fStack_1f8 * fVar349 +
                 fVar371 * fStack_3d8 + fVar308 * fStack_478 + fVar212 * fStack_438;
    fStack_914 = fStack_1f4 * fVar351 +
                 fVar374 * fStack_3d4 + fVar311 * fStack_474 + fVar214 * fStack_434;
    fStack_910 = fStack_1f0 * fVar353 +
                 fVar376 * fStack_3d0 + fVar314 * fStack_470 + fVar215 * fStack_430;
    fStack_90c = fStack_1ec * fVar355 +
                 fVar379 * fStack_3cc + fVar317 * fStack_46c + fVar216 * fStack_42c;
    fStack_908 = fStack_1e8 * fVar357 +
                 fVar381 * fStack_3c8 + fVar320 * fStack_468 + fVar217 * fStack_428;
    fStack_904 = fVar325 + fVar340 + auVar346._28_4_ + fVar373;
    auVar206._0_4_ =
         (float)local_220._0_4_ * fVar341 +
         (float)local_240._0_4_ * fVar360 +
         fVar300 * (float)local_260._0_4_ + fVar198 * (float)local_460._0_4_;
    auVar206._4_4_ =
         (float)local_220._4_4_ * fVar347 +
         (float)local_240._4_4_ * fVar369 +
         fVar305 * (float)local_260._4_4_ + fVar210 * (float)local_460._4_4_;
    auVar206._8_4_ =
         fStack_218 * fVar349 + fStack_238 * fVar371 + fVar308 * fStack_258 + fVar212 * fStack_458;
    auVar206._12_4_ =
         fStack_214 * fVar351 + fStack_234 * fVar374 + fVar311 * fStack_254 + fVar214 * fStack_454;
    auVar206._16_4_ =
         fStack_210 * fVar353 + fStack_230 * fVar376 + fVar314 * fStack_250 + fVar215 * fStack_450;
    auVar206._20_4_ =
         fStack_20c * fVar355 + fStack_22c * fVar379 + fVar317 * fStack_24c + fVar216 * fStack_44c;
    auVar206._24_4_ =
         fStack_208 * fVar357 + fStack_228 * fVar381 + fVar320 * fStack_248 + fVar217 * fStack_448;
    auVar206._28_4_ = fVar325 + fVar373 + 2.0 + -fVar219 + -3.0;
    fVar351 = auVar170._28_4_ + auVar170._28_4_;
    auVar15._4_4_ = (fVar209 + fVar209) * auVar170._4_4_;
    auVar15._0_4_ = (fVar156 + fVar156) * auVar170._0_4_;
    auVar15._8_4_ = (fVar175 + fVar175) * auVar170._8_4_;
    auVar15._12_4_ = (fVar211 + fVar211) * auVar170._12_4_;
    auVar15._16_4_ = (fVar176 + fVar176) * auVar170._16_4_;
    auVar15._20_4_ = (fVar213 + fVar213) * auVar170._20_4_;
    auVar15._24_4_ = (fVar177 + fVar177) * auVar170._24_4_;
    auVar15._28_4_ = fVar351;
    auVar99 = vsubps_avx(auVar15,auVar286._0_32_);
    auVar13._4_4_ = (fVar209 + fVar209) * (fVar234 + 2.0);
    auVar13._0_4_ = (fVar156 + fVar156) * (fVar231 + 2.0);
    auVar13._8_4_ = (fVar175 + fVar175) * (fVar237 + 2.0);
    auVar13._12_4_ = (fVar211 + fVar211) * (fVar193 + 2.0);
    auVar13._16_4_ = (fVar176 + fVar176) * (fVar194 + 2.0);
    auVar13._20_4_ = (fVar213 + fVar213) * (fVar195 + 2.0);
    auVar13._24_4_ = (fVar177 + fVar177) * (fVar196 + 2.0);
    auVar13._28_4_ = 0x40400000;
    auVar14._4_4_ = fVar209 * fVar209 * 3.0;
    auVar14._0_4_ = fVar156 * fVar156 * 3.0;
    auVar14._8_4_ = fVar175 * fVar175 * 3.0;
    auVar14._12_4_ = fVar211 * fVar211 * 3.0;
    auVar14._16_4_ = fVar176 * fVar176 * 3.0;
    auVar14._20_4_ = fVar213 * fVar213 * 3.0;
    auVar14._24_4_ = fVar177 * fVar177 * 3.0;
    auVar14._28_4_ = fVar219;
    auVar100 = vsubps_avx(auVar13,auVar14);
    auVar15 = vsubps_avx(_local_9a0,auVar15);
    fVar314 = auVar99._0_4_ * 0.5;
    fVar317 = auVar99._4_4_ * 0.5;
    fVar320 = auVar99._8_4_ * 0.5;
    fVar334 = auVar99._12_4_ * 0.5;
    fVar340 = auVar99._16_4_ * 0.5;
    fVar341 = auVar99._20_4_ * 0.5;
    fVar347 = auVar99._24_4_ * 0.5;
    fVar212 = (auVar170._0_4_ * fVar231 + (auVar170._0_4_ + auVar170._0_4_) * (fVar231 + -5.0)) *
              0.5;
    fVar216 = (auVar170._4_4_ * fVar234 + (auVar170._4_4_ + auVar170._4_4_) * (fVar234 + -5.0)) *
              0.5;
    fVar217 = (auVar170._8_4_ * fVar237 + (auVar170._8_4_ + auVar170._8_4_) * (fVar237 + -5.0)) *
              0.5;
    fVar300 = (auVar170._12_4_ * fVar193 + (auVar170._12_4_ + auVar170._12_4_) * (fVar193 + -5.0)) *
              0.5;
    fVar305 = (auVar170._16_4_ * fVar194 + (auVar170._16_4_ + auVar170._16_4_) * (fVar194 + -5.0)) *
              0.5;
    fVar308 = (auVar170._20_4_ * fVar195 + (auVar170._20_4_ + auVar170._20_4_) * (fVar195 + -5.0)) *
              0.5;
    fVar311 = (auVar170._24_4_ * fVar196 + (auVar170._24_4_ + auVar170._24_4_) * (fVar196 + -5.0)) *
              0.5;
    fVar156 = auVar100._0_4_ * 0.5;
    fVar209 = auVar100._4_4_ * 0.5;
    fVar175 = auVar100._8_4_ * 0.5;
    fVar211 = auVar100._12_4_ * 0.5;
    fVar231 = auVar100._16_4_ * 0.5;
    fVar234 = auVar100._20_4_ * 0.5;
    fVar195 = auVar100._24_4_ * 0.5;
    fVar213 = auVar15._0_4_ * 0.5;
    fVar237 = auVar15._4_4_ * 0.5;
    fVar194 = auVar15._8_4_ * 0.5;
    fVar196 = auVar15._12_4_ * 0.5;
    fVar198 = auVar15._16_4_ * 0.5;
    fVar214 = auVar15._20_4_ * 0.5;
    fVar215 = auVar15._24_4_ * 0.5;
    fVar299 = fVar219 + fVar219 + auVar99._28_4_;
    fVar280 = fVar299 + fVar219 + fVar219 + -4.0;
    auVar167 = vpermilps_avx(ZEXT416((uint)(auVar88._0_4_ * 0.04761905)),0);
    fVar176 = auVar167._0_4_;
    fVar245 = fVar176 * (fVar314 * (float)local_380._0_4_ +
                        fVar212 * (float)local_3a0._0_4_ +
                        fVar156 * (float)local_400._0_4_ + fVar213 * (float)local_820._0_4_);
    fVar177 = auVar167._4_4_;
    fVar257 = fVar177 * (fVar317 * (float)local_380._4_4_ +
                        fVar216 * (float)local_3a0._4_4_ +
                        fVar209 * (float)local_400._4_4_ + fVar237 * (float)local_820._4_4_);
    auVar21._4_4_ = fVar257;
    auVar21._0_4_ = fVar245;
    fVar193 = auVar167._8_4_;
    fVar260 = fVar193 * (fVar320 * fStack_378 +
                        fVar217 * fStack_398 + fVar175 * fStack_3f8 + fVar194 * fStack_818);
    auVar21._8_4_ = fVar260;
    fVar210 = auVar167._12_4_;
    fVar264 = fVar210 * (fVar334 * fStack_374 +
                        fVar300 * fStack_394 + fVar211 * fStack_3f4 + fVar196 * fStack_814);
    auVar21._12_4_ = fVar264;
    fVar268 = fVar176 * (fVar340 * fStack_370 +
                        fVar305 * fStack_390 + fVar231 * fStack_3f0 + fVar198 * fStack_810);
    auVar21._16_4_ = fVar268;
    fVar272 = fVar177 * (fVar341 * fStack_36c +
                        fVar308 * fStack_38c + fVar234 * fStack_3ec + fVar214 * fStack_80c);
    auVar21._20_4_ = fVar272;
    fVar276 = fVar193 * (fVar347 * fStack_368 +
                        fVar311 * fStack_388 + fVar195 * fStack_3e8 + fVar215 * fStack_808);
    auVar21._24_4_ = fVar276;
    auVar21._28_4_ = fVar280;
    fVar282 = fVar176 * ((float)local_1e0._0_4_ * fVar314 +
                        fVar212 * (float)local_3c0._0_4_ +
                        fVar156 * (float)local_420._0_4_ + fVar213 * fVar359);
    fVar287 = fVar177 * ((float)local_1e0._4_4_ * fVar317 +
                        fVar216 * (float)local_3c0._4_4_ +
                        fVar209 * (float)local_420._4_4_ + fVar237 * fVar378);
    auVar20._4_4_ = fVar287;
    auVar20._0_4_ = fVar282;
    fVar289 = fVar193 * (fStack_1d8 * fVar320 +
                        fVar217 * fStack_3b8 + fVar175 * fStack_418 + fVar194 * fVar383);
    auVar20._8_4_ = fVar289;
    fVar291 = fVar210 * (fStack_1d4 * fVar334 +
                        fVar300 * fStack_3b4 + fVar211 * fStack_414 + fVar196 * fVar373);
    auVar20._12_4_ = fVar291;
    fVar293 = fVar176 * (fStack_1d0 * fVar340 +
                        fVar305 * fStack_3b0 + fVar231 * fStack_410 + fVar198 * fVar359);
    auVar20._16_4_ = fVar293;
    fVar295 = fVar177 * (fStack_1cc * fVar341 +
                        fVar308 * fStack_3ac + fVar234 * fStack_40c + fVar214 * fVar378);
    auVar20._20_4_ = fVar295;
    fVar297 = fVar193 * (fStack_1c8 * fVar347 +
                        fVar311 * fStack_3a8 + fVar195 * fStack_408 + fVar215 * fVar383);
    auVar20._24_4_ = fVar297;
    auVar20._28_4_ = fVar299;
    fVar342 = fVar176 * ((float)local_200._0_4_ * fVar314 +
                        fVar156 * (float)local_440._0_4_ + fVar213 * (float)local_480._0_4_ +
                        fVar212 * (float)local_3e0._0_4_);
    fVar348 = fVar177 * ((float)local_200._4_4_ * fVar317 +
                        fVar209 * (float)local_440._4_4_ + fVar237 * (float)local_480._4_4_ +
                        fVar216 * (float)local_3e0._4_4_);
    auVar9._4_4_ = fVar348;
    auVar9._0_4_ = fVar342;
    fVar350 = fVar193 * (fStack_1f8 * fVar320 +
                        fVar175 * fStack_438 + fVar194 * fStack_478 + fVar217 * fStack_3d8);
    auVar9._8_4_ = fVar350;
    fVar352 = fVar210 * (fStack_1f4 * fVar334 +
                        fVar211 * fStack_434 + fVar196 * fStack_474 + fVar300 * fStack_3d4);
    auVar9._12_4_ = fVar352;
    fVar354 = fVar176 * (fStack_1f0 * fVar340 +
                        fVar231 * fStack_430 + fVar198 * fStack_470 + fVar305 * fStack_3d0);
    auVar9._16_4_ = fVar354;
    fVar356 = fVar177 * (fStack_1ec * fVar341 +
                        fVar234 * fStack_42c + fVar214 * fStack_46c + fVar308 * fStack_3cc);
    auVar9._20_4_ = fVar356;
    fVar358 = fVar193 * (fStack_1e8 * fVar347 +
                        fVar195 * fStack_428 + fVar215 * fStack_468 + fVar311 * fStack_3c8);
    auVar9._24_4_ = fVar358;
    auVar9._28_4_ = -auVar170._28_4_;
    fVar213 = fVar176 * ((float)local_220._0_4_ * fVar314 +
                        (float)local_240._0_4_ * fVar212 +
                        fVar156 * (float)local_460._0_4_ + (float)local_260._0_4_ * fVar213);
    fVar237 = fVar177 * ((float)local_220._4_4_ * fVar317 +
                        (float)local_240._4_4_ * fVar216 +
                        fVar209 * (float)local_460._4_4_ + (float)local_260._4_4_ * fVar237);
    auVar16._4_4_ = fVar237;
    auVar16._0_4_ = fVar213;
    fVar194 = fVar193 * (fStack_218 * fVar320 +
                        fStack_238 * fVar217 + fVar175 * fStack_458 + fStack_258 * fVar194);
    auVar16._8_4_ = fVar194;
    fVar212 = fVar210 * (fStack_214 * fVar334 +
                        fStack_234 * fVar300 + fVar211 * fStack_454 + fStack_254 * fVar196);
    auVar16._12_4_ = fVar212;
    fVar176 = fVar176 * (fStack_210 * fVar340 +
                        fStack_230 * fVar305 + fVar231 * fStack_450 + fStack_250 * fVar198);
    auVar16._16_4_ = fVar176;
    fVar177 = fVar177 * (fStack_20c * fVar341 +
                        fStack_22c * fVar308 + fVar234 * fStack_44c + fStack_24c * fVar214);
    auVar16._20_4_ = fVar177;
    fVar193 = fVar193 * (fStack_208 * fVar347 +
                        fStack_228 * fVar311 + fVar195 * fStack_448 + fStack_248 * fVar215);
    auVar16._24_4_ = fVar193;
    auVar16._28_4_ = fVar210;
    auVar65._4_4_ = fVar307;
    auVar65._0_4_ = fVar302;
    auVar65._8_4_ = fVar310;
    auVar65._12_4_ = fVar313;
    auVar65._16_4_ = fVar316;
    auVar65._20_4_ = fVar319;
    auVar65._24_4_ = fVar322;
    auVar65._28_4_ = fVar325;
    auVar99 = vperm2f128_avx(auVar65,auVar65,1);
    auVar99 = vshufps_avx(auVar99,auVar65,0x30);
    auVar13 = vshufps_avx(auVar65,auVar99,0x29);
    auVar69._4_4_ = fStack_91c;
    auVar69._0_4_ = local_920;
    auVar69._8_4_ = fStack_918;
    auVar69._12_4_ = fStack_914;
    auVar69._16_4_ = fStack_910;
    auVar69._20_4_ = fStack_90c;
    auVar69._24_4_ = fStack_908;
    auVar69._28_4_ = fStack_904;
    auVar99 = vperm2f128_avx(auVar69,auVar69,1);
    auVar99 = vshufps_avx(auVar99,auVar69,0x30);
    _local_9a0 = vshufps_avx(auVar69,auVar99,0x29);
    auVar100 = vsubps_avx(auVar206,auVar16);
    auVar99 = vperm2f128_avx(auVar100,auVar100,1);
    auVar99 = vshufps_avx(auVar99,auVar100,0x30);
    auVar14 = vshufps_avx(auVar100,auVar99,0x29);
    local_5e0 = vsubps_avx(auVar13,auVar65);
    local_5c0 = vsubps_avx(_local_9a0,auVar69);
    fVar209 = local_5e0._0_4_;
    fVar219 = local_5e0._4_4_;
    auVar17._4_4_ = fVar348 * fVar219;
    auVar17._0_4_ = fVar342 * fVar209;
    fVar195 = local_5e0._8_4_;
    auVar17._8_4_ = fVar350 * fVar195;
    fVar215 = local_5e0._12_4_;
    auVar17._12_4_ = fVar352 * fVar215;
    fVar311 = local_5e0._16_4_;
    auVar17._16_4_ = fVar354 * fVar311;
    fVar341 = local_5e0._20_4_;
    auVar17._20_4_ = fVar356 * fVar341;
    fVar357 = local_5e0._24_4_;
    auVar17._24_4_ = fVar358 * fVar357;
    auVar17._28_4_ = auVar100._28_4_;
    fVar175 = local_5c0._0_4_;
    fVar231 = local_5c0._4_4_;
    auVar18._4_4_ = fVar287 * fVar231;
    auVar18._0_4_ = fVar282 * fVar175;
    fVar196 = local_5c0._8_4_;
    auVar18._8_4_ = fVar289 * fVar196;
    fVar216 = local_5c0._12_4_;
    auVar18._12_4_ = fVar291 * fVar216;
    fVar314 = local_5c0._16_4_;
    auVar18._16_4_ = fVar293 * fVar314;
    fVar347 = local_5c0._20_4_;
    auVar18._20_4_ = fVar295 * fVar347;
    fVar359 = local_5c0._24_4_;
    auVar18._24_4_ = fVar297 * fVar359;
    auVar18._28_4_ = auVar99._28_4_;
    auVar16 = vsubps_avx(auVar18,auVar17);
    auVar67._4_4_ = fVar306;
    auVar67._0_4_ = fVar301;
    auVar67._8_4_ = fVar309;
    auVar67._12_4_ = fVar312;
    auVar67._16_4_ = fVar315;
    auVar67._20_4_ = fVar318;
    auVar67._24_4_ = fVar321;
    auVar67._28_4_ = fVar324;
    auVar99 = vperm2f128_avx(auVar67,auVar67,1);
    auVar99 = vshufps_avx(auVar99,auVar67,0x30);
    local_760 = vshufps_avx(auVar67,auVar99,0x29);
    local_600 = vsubps_avx(local_760,auVar67);
    auVar19._4_4_ = fVar257 * fVar231;
    auVar19._0_4_ = fVar245 * fVar175;
    auVar19._8_4_ = fVar260 * fVar196;
    auVar19._12_4_ = fVar264 * fVar216;
    auVar19._16_4_ = fVar268 * fVar314;
    auVar19._20_4_ = fVar272 * fVar347;
    auVar19._24_4_ = fVar276 * fVar359;
    auVar19._28_4_ = local_760._28_4_;
    fVar211 = local_600._0_4_;
    fVar234 = local_600._4_4_;
    auVar252._4_4_ = fVar348 * fVar234;
    auVar252._0_4_ = fVar342 * fVar211;
    fVar198 = local_600._8_4_;
    auVar252._8_4_ = fVar350 * fVar198;
    fVar217 = local_600._12_4_;
    auVar252._12_4_ = fVar352 * fVar217;
    fVar317 = local_600._16_4_;
    auVar252._16_4_ = fVar354 * fVar317;
    fVar349 = local_600._20_4_;
    auVar252._20_4_ = fVar356 * fVar349;
    fVar360 = local_600._24_4_;
    auVar252._24_4_ = fVar358 * fVar360;
    auVar252._28_4_ = fVar324;
    auVar17 = vsubps_avx(auVar252,auVar19);
    auVar22._4_4_ = fVar287 * fVar234;
    auVar22._0_4_ = fVar282 * fVar211;
    auVar22._8_4_ = fVar289 * fVar198;
    auVar22._12_4_ = fVar291 * fVar217;
    auVar22._16_4_ = fVar293 * fVar317;
    auVar22._20_4_ = fVar295 * fVar349;
    auVar22._24_4_ = fVar297 * fVar360;
    auVar22._28_4_ = fVar324;
    auVar23._4_4_ = fVar257 * fVar219;
    auVar23._0_4_ = fVar245 * fVar209;
    auVar23._8_4_ = fVar260 * fVar195;
    auVar23._12_4_ = fVar264 * fVar215;
    auVar23._16_4_ = fVar268 * fVar311;
    auVar23._20_4_ = fVar272 * fVar341;
    auVar23._24_4_ = fVar276 * fVar357;
    auVar23._28_4_ = fVar351;
    auVar18 = vsubps_avx(auVar23,auVar22);
    fVar156 = auVar18._28_4_;
    fVar214 = auVar17._28_4_ + fVar156;
    auVar171._0_4_ = fVar211 * fVar211 + fVar209 * fVar209 + fVar175 * fVar175;
    auVar171._4_4_ = fVar234 * fVar234 + fVar219 * fVar219 + fVar231 * fVar231;
    auVar171._8_4_ = fVar198 * fVar198 + fVar195 * fVar195 + fVar196 * fVar196;
    auVar171._12_4_ = fVar217 * fVar217 + fVar215 * fVar215 + fVar216 * fVar216;
    auVar171._16_4_ = fVar317 * fVar317 + fVar311 * fVar311 + fVar314 * fVar314;
    auVar171._20_4_ = fVar349 * fVar349 + fVar341 * fVar341 + fVar347 * fVar347;
    auVar171._24_4_ = fVar360 * fVar360 + fVar357 * fVar357 + fVar359 * fVar359;
    auVar171._28_4_ = fVar156 + fVar156 + fVar214;
    auVar99 = vrcpps_avx(auVar171);
    fVar156 = auVar99._0_4_;
    fVar300 = auVar99._4_4_;
    auVar24._4_4_ = fVar300 * auVar171._4_4_;
    auVar24._0_4_ = fVar156 * auVar171._0_4_;
    fVar305 = auVar99._8_4_;
    auVar24._8_4_ = fVar305 * auVar171._8_4_;
    fVar308 = auVar99._12_4_;
    auVar24._12_4_ = fVar308 * auVar171._12_4_;
    fVar320 = auVar99._16_4_;
    auVar24._16_4_ = fVar320 * auVar171._16_4_;
    fVar334 = auVar99._20_4_;
    auVar24._20_4_ = fVar334 * auVar171._20_4_;
    fVar340 = auVar99._24_4_;
    auVar24._24_4_ = fVar340 * auVar171._24_4_;
    auVar24._28_4_ = fVar351;
    auVar364._8_4_ = 0x3f800000;
    auVar364._0_8_ = 0x3f8000003f800000;
    auVar364._12_4_ = 0x3f800000;
    auVar364._16_4_ = 0x3f800000;
    auVar364._20_4_ = 0x3f800000;
    auVar364._24_4_ = 0x3f800000;
    auVar364._28_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar364,auVar24);
    fVar156 = auVar19._0_4_ * fVar156 + fVar156;
    fVar300 = auVar19._4_4_ * fVar300 + fVar300;
    fVar305 = auVar19._8_4_ * fVar305 + fVar305;
    fVar308 = auVar19._12_4_ * fVar308 + fVar308;
    fVar320 = auVar19._16_4_ * fVar320 + fVar320;
    fVar334 = auVar19._20_4_ * fVar334 + fVar334;
    fVar340 = auVar19._24_4_ * fVar340 + fVar340;
    auVar100 = vperm2f128_avx(auVar20,auVar20,1);
    auVar100 = vshufps_avx(auVar100,auVar20,0x30);
    auVar100 = vshufps_avx(auVar20,auVar100,0x29);
    auVar15 = vperm2f128_avx(auVar9,auVar9,1);
    auVar15 = vshufps_avx(auVar15,auVar9,0x30);
    local_980 = vshufps_avx(auVar9,auVar15,0x29);
    fVar361 = local_980._0_4_;
    fVar370 = local_980._4_4_;
    auVar25._4_4_ = fVar370 * fVar219;
    auVar25._0_4_ = fVar361 * fVar209;
    fVar372 = local_980._8_4_;
    auVar25._8_4_ = fVar372 * fVar195;
    fVar375 = local_980._12_4_;
    auVar25._12_4_ = fVar375 * fVar215;
    fVar377 = local_980._16_4_;
    auVar25._16_4_ = fVar377 * fVar311;
    fVar380 = local_980._20_4_;
    auVar25._20_4_ = fVar380 * fVar341;
    fVar382 = local_980._24_4_;
    auVar25._24_4_ = fVar382 * fVar357;
    auVar25._28_4_ = auVar15._28_4_;
    fVar283 = auVar100._0_4_;
    fVar288 = auVar100._4_4_;
    auVar26._4_4_ = fVar288 * fVar231;
    auVar26._0_4_ = fVar283 * fVar175;
    fVar290 = auVar100._8_4_;
    auVar26._8_4_ = fVar290 * fVar196;
    fVar292 = auVar100._12_4_;
    auVar26._12_4_ = fVar292 * fVar216;
    fVar294 = auVar100._16_4_;
    auVar26._16_4_ = fVar294 * fVar314;
    fVar296 = auVar100._20_4_;
    auVar26._20_4_ = fVar296 * fVar347;
    fVar298 = auVar100._24_4_;
    auVar26._24_4_ = fVar298 * fVar359;
    auVar26._28_4_ = -auVar170._28_4_;
    auVar20 = vsubps_avx(auVar26,auVar25);
    auVar100 = vperm2f128_avx(auVar21,auVar21,1);
    auVar100 = vshufps_avx(auVar100,auVar21,0x30);
    auVar15 = vshufps_avx(auVar21,auVar100,0x29);
    fVar246 = auVar15._0_4_;
    fVar258 = auVar15._4_4_;
    auVar27._4_4_ = fVar258 * fVar231;
    auVar27._0_4_ = fVar246 * fVar175;
    fVar261 = auVar15._8_4_;
    auVar27._8_4_ = fVar261 * fVar196;
    fVar265 = auVar15._12_4_;
    auVar27._12_4_ = fVar265 * fVar216;
    fVar269 = auVar15._16_4_;
    auVar27._16_4_ = fVar269 * fVar314;
    fVar273 = auVar15._20_4_;
    auVar27._20_4_ = fVar273 * fVar347;
    fVar277 = auVar15._24_4_;
    auVar27._24_4_ = fVar277 * fVar359;
    auVar27._28_4_ = auVar100._28_4_;
    auVar28._4_4_ = fVar370 * fVar234;
    auVar28._0_4_ = fVar361 * fVar211;
    auVar28._8_4_ = fVar372 * fVar198;
    auVar28._12_4_ = fVar375 * fVar217;
    auVar28._16_4_ = fVar377 * fVar317;
    auVar28._20_4_ = fVar380 * fVar349;
    uVar75 = local_980._28_4_;
    auVar28._24_4_ = fVar382 * fVar360;
    auVar28._28_4_ = uVar75;
    auVar100 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar288 * fVar234;
    auVar29._0_4_ = fVar283 * fVar211;
    auVar29._8_4_ = fVar290 * fVar198;
    auVar29._12_4_ = fVar292 * fVar217;
    auVar29._16_4_ = fVar294 * fVar317;
    auVar29._20_4_ = fVar296 * fVar349;
    auVar29._24_4_ = fVar298 * fVar360;
    auVar29._28_4_ = uVar75;
    auVar30._4_4_ = fVar258 * fVar219;
    auVar30._0_4_ = fVar246 * fVar209;
    auVar30._8_4_ = fVar261 * fVar195;
    auVar30._12_4_ = fVar265 * fVar215;
    auVar30._16_4_ = fVar269 * fVar311;
    auVar30._20_4_ = fVar273 * fVar341;
    auVar30._24_4_ = fVar277 * fVar357;
    auVar30._28_4_ = fStack_204;
    auVar21 = vsubps_avx(auVar30,auVar29);
    auVar31._4_4_ =
         (auVar16._4_4_ * auVar16._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar18._4_4_ * auVar18._4_4_) * fVar300;
    auVar31._0_4_ =
         (auVar16._0_4_ * auVar16._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar18._0_4_ * auVar18._0_4_) * fVar156;
    auVar31._8_4_ =
         (auVar16._8_4_ * auVar16._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar18._8_4_ * auVar18._8_4_) * fVar305;
    auVar31._12_4_ =
         (auVar16._12_4_ * auVar16._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar18._12_4_ * auVar18._12_4_) * fVar308;
    auVar31._16_4_ =
         (auVar16._16_4_ * auVar16._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar18._16_4_ * auVar18._16_4_) * fVar320;
    auVar31._20_4_ =
         (auVar16._20_4_ * auVar16._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar18._20_4_ * auVar18._20_4_) * fVar334;
    auVar31._24_4_ =
         (auVar16._24_4_ * auVar16._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar18._24_4_ * auVar18._24_4_) * fVar340;
    auVar31._28_4_ = auVar16._28_4_ + fVar214;
    auVar32._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar100._4_4_ * auVar100._4_4_ + auVar21._4_4_ * auVar21._4_4_) * fVar300;
    auVar32._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar100._0_4_ * auVar100._0_4_ + auVar21._0_4_ * auVar21._0_4_) * fVar156;
    auVar32._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar100._8_4_ * auVar100._8_4_ + auVar21._8_4_ * auVar21._8_4_) * fVar305;
    auVar32._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar100._12_4_ * auVar100._12_4_ + auVar21._12_4_ * auVar21._12_4_) * fVar308;
    auVar32._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar100._16_4_ * auVar100._16_4_ + auVar21._16_4_ * auVar21._16_4_) * fVar320;
    auVar32._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar100._20_4_ * auVar100._20_4_ + auVar21._20_4_ * auVar21._20_4_) * fVar334;
    auVar32._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar100._24_4_ * auVar100._24_4_ + auVar21._24_4_ * auVar21._24_4_) * fVar340;
    auVar32._28_4_ = auVar19._28_4_ + auVar99._28_4_;
    auVar99 = vmaxps_avx(auVar31,auVar32);
    auVar100 = vperm2f128_avx(auVar206,auVar206,1);
    auVar100 = vshufps_avx(auVar100,auVar206,0x30);
    auVar16 = vshufps_avx(auVar206,auVar100,0x29);
    auVar101._0_4_ = auVar206._0_4_ + fVar213;
    auVar101._4_4_ = auVar206._4_4_ + fVar237;
    auVar101._8_4_ = auVar206._8_4_ + fVar194;
    auVar101._12_4_ = auVar206._12_4_ + fVar212;
    auVar101._16_4_ = auVar206._16_4_ + fVar176;
    auVar101._20_4_ = auVar206._20_4_ + fVar177;
    auVar101._24_4_ = auVar206._24_4_ + fVar193;
    auVar101._28_4_ = auVar206._28_4_ + fVar210;
    auVar100 = vmaxps_avx(auVar206,auVar101);
    auVar15 = vmaxps_avx(auVar14,auVar16);
    auVar100 = vmaxps_avx(auVar100,auVar15);
    auVar15 = vrsqrtps_avx(auVar171);
    fVar156 = auVar15._0_4_;
    fVar176 = auVar15._4_4_;
    fVar213 = auVar15._8_4_;
    fVar177 = auVar15._12_4_;
    fVar237 = auVar15._16_4_;
    fVar193 = auVar15._20_4_;
    fVar194 = auVar15._24_4_;
    auVar33._4_4_ = fVar176 * fVar176 * fVar176 * auVar171._4_4_ * 0.5;
    auVar33._0_4_ = fVar156 * fVar156 * fVar156 * auVar171._0_4_ * 0.5;
    auVar33._8_4_ = fVar213 * fVar213 * fVar213 * auVar171._8_4_ * 0.5;
    auVar33._12_4_ = fVar177 * fVar177 * fVar177 * auVar171._12_4_ * 0.5;
    auVar33._16_4_ = fVar237 * fVar237 * fVar237 * auVar171._16_4_ * 0.5;
    auVar33._20_4_ = fVar193 * fVar193 * fVar193 * auVar171._20_4_ * 0.5;
    auVar33._24_4_ = fVar194 * fVar194 * fVar194 * auVar171._24_4_ * 0.5;
    auVar33._28_4_ = auVar171._28_4_;
    auVar34._4_4_ = fVar176 * 1.5;
    auVar34._0_4_ = fVar156 * 1.5;
    auVar34._8_4_ = fVar213 * 1.5;
    auVar34._12_4_ = fVar177 * 1.5;
    auVar34._16_4_ = fVar237 * 1.5;
    auVar34._20_4_ = fVar193 * 1.5;
    auVar34._24_4_ = fVar194 * 1.5;
    auVar34._28_4_ = auVar15._28_4_;
    auVar17 = vsubps_avx(auVar34,auVar33);
    auVar285 = ZEXT3264(auVar17);
    auVar66._4_4_ = fVar307;
    auVar66._0_4_ = fVar302;
    auVar66._8_4_ = fVar310;
    auVar66._12_4_ = fVar313;
    auVar66._16_4_ = fVar316;
    auVar66._20_4_ = fVar319;
    auVar66._24_4_ = fVar322;
    auVar66._28_4_ = fVar325;
    auVar18 = vsubps_avx(ZEXT832(0) << 0x20,auVar66);
    auVar19 = vsubps_avx(ZEXT832(0) << 0x20,auVar69);
    fVar176 = auVar19._0_4_;
    fVar237 = auVar19._4_4_;
    fVar210 = auVar19._8_4_;
    fVar300 = auVar19._12_4_;
    fVar320 = auVar19._16_4_;
    fVar351 = auVar19._20_4_;
    fVar378 = auVar19._24_4_;
    fVar213 = auVar18._0_4_;
    fVar193 = auVar18._4_4_;
    fVar212 = auVar18._8_4_;
    fVar305 = auVar18._12_4_;
    fVar334 = auVar18._16_4_;
    fVar353 = auVar18._20_4_;
    fVar369 = auVar18._24_4_;
    auVar68._4_4_ = fVar306;
    auVar68._0_4_ = fVar301;
    auVar68._8_4_ = fVar309;
    auVar68._12_4_ = fVar312;
    auVar68._16_4_ = fVar315;
    auVar68._20_4_ = fVar318;
    auVar68._24_4_ = fVar321;
    auVar68._28_4_ = fVar324;
    auVar20 = vsubps_avx(ZEXT832(0) << 0x20,auVar68);
    fVar177 = auVar20._0_4_;
    fVar194 = auVar20._4_4_;
    fVar214 = auVar20._8_4_;
    fVar308 = auVar20._12_4_;
    fVar340 = auVar20._16_4_;
    fVar355 = auVar20._20_4_;
    fVar383 = auVar20._24_4_;
    auVar365._0_4_ =
         (float)local_7e0._0_4_ * fVar177 +
         (float)local_800._0_4_ * fVar213 + (float)local_7c0._0_4_ * fVar176;
    auVar365._4_4_ =
         (float)local_7e0._4_4_ * fVar194 +
         (float)local_800._4_4_ * fVar193 + (float)local_7c0._4_4_ * fVar237;
    auVar365._8_4_ = fStack_7d8 * fVar214 + fStack_7f8 * fVar212 + fStack_7b8 * fVar210;
    auVar365._12_4_ = fStack_7d4 * fVar308 + fStack_7f4 * fVar305 + fStack_7b4 * fVar300;
    auVar365._16_4_ = fStack_7d0 * fVar340 + fStack_7f0 * fVar334 + fStack_7b0 * fVar320;
    auVar365._20_4_ = fStack_7cc * fVar355 + fStack_7ec * fVar353 + fStack_7ac * fVar351;
    auVar365._24_4_ = fStack_7c8 * fVar383 + fStack_7e8 * fVar369 + fStack_7a8 * fVar378;
    auVar365._28_4_ = fStack_204 + auVar21._28_4_ + auVar15._28_4_;
    auVar384._0_4_ = fVar177 * fVar177 + fVar213 * fVar213 + fVar176 * fVar176;
    auVar384._4_4_ = fVar194 * fVar194 + fVar193 * fVar193 + fVar237 * fVar237;
    auVar384._8_4_ = fVar214 * fVar214 + fVar212 * fVar212 + fVar210 * fVar210;
    auVar384._12_4_ = fVar308 * fVar308 + fVar305 * fVar305 + fVar300 * fVar300;
    auVar384._16_4_ = fVar340 * fVar340 + fVar334 * fVar334 + fVar320 * fVar320;
    auVar384._20_4_ = fVar355 * fVar355 + fVar353 * fVar353 + fVar351 * fVar351;
    auVar384._24_4_ = fVar383 * fVar383 + fVar369 * fVar369 + fVar378 * fVar378;
    auVar384._28_4_ = auVar206._28_4_ + auVar206._28_4_ + fStack_204;
    fVar221 = auVar17._0_4_;
    fVar233 = auVar17._4_4_;
    fVar236 = auVar17._8_4_;
    fVar238 = auVar17._12_4_;
    fVar240 = auVar17._16_4_;
    fVar242 = auVar17._20_4_;
    fVar244 = auVar17._24_4_;
    fVar218 = fStack_7e4 + local_5c0._28_4_;
    local_500 = (float)local_7e0._0_4_ * fVar211 * fVar221 +
                fVar221 * fVar209 * (float)local_800._0_4_ +
                (float)local_7c0._0_4_ * fVar221 * fVar175;
    fStack_4fc = (float)local_7e0._4_4_ * fVar234 * fVar233 +
                 fVar233 * fVar219 * (float)local_800._4_4_ +
                 (float)local_7c0._4_4_ * fVar233 * fVar231;
    fStack_4f8 = fStack_7d8 * fVar198 * fVar236 +
                 fVar236 * fVar195 * fStack_7f8 + fStack_7b8 * fVar236 * fVar196;
    fStack_4f4 = fStack_7d4 * fVar217 * fVar238 +
                 fVar238 * fVar215 * fStack_7f4 + fStack_7b4 * fVar238 * fVar216;
    fStack_4f0 = fStack_7d0 * fVar317 * fVar240 +
                 fVar240 * fVar311 * fStack_7f0 + fStack_7b0 * fVar240 * fVar314;
    fStack_4ec = fStack_7cc * fVar349 * fVar242 +
                 fVar242 * fVar341 * fStack_7ec + fStack_7ac * fVar242 * fVar347;
    fStack_4e8 = fStack_7c8 * fVar360 * fVar244 +
                 fVar244 * fVar357 * fStack_7e8 + fStack_7a8 * fVar244 * fVar359;
    fVar156 = fStack_7c4 + fVar218;
    fVar247 = fVar177 * fVar211 * fVar221 +
              fVar221 * fVar209 * fVar213 + fVar221 * fVar175 * fVar176;
    fVar259 = fVar194 * fVar234 * fVar233 +
              fVar233 * fVar219 * fVar193 + fVar233 * fVar231 * fVar237;
    fVar262 = fVar214 * fVar198 * fVar236 +
              fVar236 * fVar195 * fVar212 + fVar236 * fVar196 * fVar210;
    fVar266 = fVar308 * fVar217 * fVar238 +
              fVar238 * fVar215 * fVar305 + fVar238 * fVar216 * fVar300;
    fVar270 = fVar340 * fVar317 * fVar240 +
              fVar240 * fVar311 * fVar334 + fVar240 * fVar314 * fVar320;
    fVar274 = fVar355 * fVar349 * fVar242 +
              fVar242 * fVar341 * fVar353 + fVar242 * fVar347 * fVar351;
    fVar278 = fVar383 * fVar360 * fVar244 +
              fVar244 * fVar357 * fVar369 + fVar244 * fVar359 * fVar378;
    fVar281 = fStack_7e4 + fVar156;
    auVar35._4_4_ = fStack_4fc * fVar259;
    auVar35._0_4_ = local_500 * fVar247;
    auVar35._8_4_ = fStack_4f8 * fVar262;
    auVar35._12_4_ = fStack_4f4 * fVar266;
    auVar35._16_4_ = fStack_4f0 * fVar270;
    auVar35._20_4_ = fStack_4ec * fVar274;
    auVar35._24_4_ = fStack_4e8 * fVar278;
    auVar35._28_4_ = fVar156;
    auVar15 = vsubps_avx(auVar365,auVar35);
    auVar36._4_4_ = fVar259 * fVar259;
    auVar36._0_4_ = fVar247 * fVar247;
    auVar36._8_4_ = fVar262 * fVar262;
    auVar36._12_4_ = fVar266 * fVar266;
    auVar36._16_4_ = fVar270 * fVar270;
    auVar36._20_4_ = fVar274 * fVar274;
    auVar36._24_4_ = fVar278 * fVar278;
    auVar36._28_4_ = fStack_7e4;
    auVar21 = vsubps_avx(auVar384,auVar36);
    auStack_8f8 = auVar21._8_24_;
    _local_660 = vsqrtps_avx(auVar99);
    fVar156 = (auVar100._0_4_ + local_660._0_4_) * 1.0000002;
    fVar371 = (auVar100._4_4_ + local_660._4_4_) * 1.0000002;
    fVar374 = (auVar100._8_4_ + local_660._8_4_) * 1.0000002;
    fVar376 = (auVar100._12_4_ + local_660._12_4_) * 1.0000002;
    fVar379 = (auVar100._16_4_ + local_660._16_4_) * 1.0000002;
    fVar381 = (auVar100._20_4_ + local_660._20_4_) * 1.0000002;
    fVar140 = (auVar100._24_4_ + local_660._24_4_) * 1.0000002;
    auVar37._4_4_ = fVar371 * fVar371;
    auVar37._0_4_ = fVar156 * fVar156;
    auVar37._8_4_ = fVar374 * fVar374;
    auVar37._12_4_ = fVar376 * fVar376;
    auVar37._16_4_ = fVar379 * fVar379;
    auVar37._20_4_ = fVar381 * fVar381;
    auVar37._24_4_ = fVar140 * fVar140;
    auVar37._28_4_ = auVar100._28_4_ + local_660._28_4_;
    fVar326 = auVar15._0_4_ + auVar15._0_4_;
    fVar333 = auVar15._4_4_ + auVar15._4_4_;
    local_a00._0_8_ = CONCAT44(fVar333,fVar326);
    local_a00._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    local_a00._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    local_a00._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    local_a00._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    local_a00._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    local_a00._28_4_ = auVar15._28_4_ + auVar15._28_4_;
    auVar15 = vsubps_avx(auVar21,auVar37);
    local_2c0._4_4_ = fStack_4fc * fStack_4fc;
    local_2c0._0_4_ = local_500 * local_500;
    local_2c0._8_4_ = fStack_4f8 * fStack_4f8;
    local_2c0._12_4_ = fStack_4f4 * fStack_4f4;
    local_2c0._16_4_ = fStack_4f0 * fStack_4f0;
    local_2c0._20_4_ = fStack_4ec * fStack_4ec;
    local_2c0._24_4_ = fStack_4e8 * fStack_4e8;
    local_2c0._28_4_ = uStack_7a4;
    local_4e0 = vsubps_avx(local_280,local_2c0);
    local_580._4_4_ = fVar333 * fVar333;
    local_580._0_4_ = fVar326 * fVar326;
    local_580._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    local_580._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    local_580._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    local_580._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    local_580._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    local_580._28_4_ = auVar100._28_4_;
    fVar371 = local_4e0._0_4_;
    local_5a0._0_4_ = fVar371 * 4.0;
    fVar374 = local_4e0._4_4_;
    local_5a0._4_4_ = fVar374 * 4.0;
    fVar376 = local_4e0._8_4_;
    fStack_598 = fVar376 * 4.0;
    fVar379 = local_4e0._12_4_;
    fStack_594 = fVar379 * 4.0;
    fVar381 = local_4e0._16_4_;
    fStack_590 = fVar381 * 4.0;
    fVar140 = local_4e0._20_4_;
    fStack_58c = fVar140 * 4.0;
    fVar323 = local_4e0._24_4_;
    fStack_588 = fVar323 * 4.0;
    uStack_584 = 0x40800000;
    auVar38._4_4_ = auVar15._4_4_ * (float)local_5a0._4_4_;
    auVar38._0_4_ = auVar15._0_4_ * (float)local_5a0._0_4_;
    auVar38._8_4_ = auVar15._8_4_ * fStack_598;
    auVar38._12_4_ = auVar15._12_4_ * fStack_594;
    auVar38._16_4_ = auVar15._16_4_ * fStack_590;
    auVar38._20_4_ = auVar15._20_4_ * fStack_58c;
    auVar38._24_4_ = auVar15._24_4_ * fStack_588;
    auVar38._28_4_ = 0x40800000;
    auVar100 = vsubps_avx(local_580,auVar38);
    auVar99 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,5);
    fVar156 = local_4e0._28_4_;
    if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar99 >> 0x7f,0) == '\0') &&
          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar99 >> 0xbf,0) == '\0') &&
        (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f]) {
      fStack_b78 = INFINITY;
      local_b80 = (undefined1  [8])0x7f8000007f800000;
      fStack_b74 = INFINITY;
      uStack_b70 = 0x7f800000;
      uStack_b6c = 0x7f800000;
      uStack_b68 = 0x7f800000;
      uStack_b64 = 0x7f800000;
      auVar385._8_4_ = 0xff800000;
      auVar385._0_8_ = 0xff800000ff800000;
      auVar385._12_4_ = 0xff800000;
      auVar385._16_4_ = 0xff800000;
      auVar385._20_4_ = 0xff800000;
      auVar385._24_4_ = 0xff800000;
      auVar385._28_4_ = 0xff800000;
      auVar9 = local_580;
    }
    else {
      auVar9 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,5);
      auVar252 = vsqrtps_avx(auVar100);
      auVar225._0_4_ = fVar371 + fVar371;
      auVar225._4_4_ = fVar374 + fVar374;
      auVar225._8_4_ = fVar376 + fVar376;
      auVar225._12_4_ = fVar379 + fVar379;
      auVar225._16_4_ = fVar381 + fVar381;
      auVar225._20_4_ = fVar140 + fVar140;
      auVar225._24_4_ = fVar323 + fVar323;
      auVar225._28_4_ = fVar156 + fVar156;
      auVar100 = vrcpps_avx(auVar225);
      fVar220 = auVar100._0_4_;
      fVar232 = auVar100._4_4_;
      auVar39._4_4_ = auVar225._4_4_ * fVar232;
      auVar39._0_4_ = auVar225._0_4_ * fVar220;
      fVar235 = auVar100._8_4_;
      auVar39._8_4_ = auVar225._8_4_ * fVar235;
      fVar178 = auVar100._12_4_;
      auVar39._12_4_ = auVar225._12_4_ * fVar178;
      fVar239 = auVar100._16_4_;
      auVar39._16_4_ = auVar225._16_4_ * fVar239;
      fVar241 = auVar100._20_4_;
      auVar39._20_4_ = auVar225._20_4_ * fVar241;
      fVar243 = auVar100._24_4_;
      auVar39._24_4_ = auVar225._24_4_ * fVar243;
      auVar39._28_4_ = auVar225._28_4_;
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = 0x3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar148._16_4_ = 0x3f800000;
      auVar148._20_4_ = 0x3f800000;
      auVar148._24_4_ = 0x3f800000;
      auVar148._28_4_ = 0x3f800000;
      auVar22 = vsubps_avx(auVar148,auVar39);
      fVar220 = fVar220 + fVar220 * auVar22._0_4_;
      fVar232 = fVar232 + fVar232 * auVar22._4_4_;
      fVar235 = fVar235 + fVar235 * auVar22._8_4_;
      fVar178 = fVar178 + fVar178 * auVar22._12_4_;
      fVar239 = fVar239 + fVar239 * auVar22._16_4_;
      fVar241 = fVar241 + fVar241 * auVar22._20_4_;
      fVar243 = fVar243 + fVar243 * auVar22._24_4_;
      auVar251._0_8_ = CONCAT44(fVar333,fVar326) ^ 0x8000000080000000;
      auVar251._8_4_ = -local_a00._8_4_;
      auVar251._12_4_ = -local_a00._12_4_;
      auVar251._16_4_ = -local_a00._16_4_;
      auVar251._20_4_ = -local_a00._20_4_;
      auVar251._24_4_ = -local_a00._24_4_;
      auVar251._28_4_ = -local_a00._28_4_;
      auVar23 = vsubps_avx(auVar251,auVar252);
      fVar326 = auVar23._0_4_ * fVar220;
      fVar333 = auVar23._4_4_ * fVar232;
      auVar40._4_4_ = fVar333;
      auVar40._0_4_ = fVar326;
      fVar263 = auVar23._8_4_ * fVar235;
      auVar40._8_4_ = fVar263;
      fVar267 = auVar23._12_4_ * fVar178;
      auVar40._12_4_ = fVar267;
      fVar271 = auVar23._16_4_ * fVar239;
      auVar40._16_4_ = fVar271;
      fVar275 = auVar23._20_4_ * fVar241;
      auVar40._20_4_ = fVar275;
      fVar279 = auVar23._24_4_ * fVar243;
      auVar40._24_4_ = fVar279;
      auVar40._28_4_ = auVar23._28_4_;
      auVar252 = vsubps_avx(auVar252,local_a00);
      fVar220 = auVar252._0_4_ * fVar220;
      fVar232 = auVar252._4_4_ * fVar232;
      auVar41._4_4_ = fVar232;
      auVar41._0_4_ = fVar220;
      fVar235 = auVar252._8_4_ * fVar235;
      auVar41._8_4_ = fVar235;
      fVar178 = auVar252._12_4_ * fVar178;
      auVar41._12_4_ = fVar178;
      fVar239 = auVar252._16_4_ * fVar239;
      auVar41._16_4_ = fVar239;
      fVar241 = auVar252._20_4_ * fVar241;
      auVar41._20_4_ = fVar241;
      fVar243 = auVar252._24_4_ * fVar243;
      auVar41._24_4_ = fVar243;
      auVar41._28_4_ = auVar252._28_4_;
      local_640 = fVar221 * (fVar247 + local_500 * fVar326);
      fStack_63c = fVar233 * (fVar259 + fStack_4fc * fVar333);
      fStack_638 = fVar236 * (fVar262 + fStack_4f8 * fVar263);
      fStack_634 = fVar238 * (fVar266 + fStack_4f4 * fVar267);
      fStack_630 = fVar240 * (fVar270 + fStack_4f0 * fVar271);
      fStack_62c = fVar242 * (fVar274 + fStack_4ec * fVar275);
      fStack_628 = fVar244 * (fVar278 + fStack_4e8 * fVar279);
      fStack_624 = fVar281 + auVar100._28_4_ + auVar22._28_4_;
      auVar327._8_4_ = 0x7fffffff;
      auVar327._0_8_ = 0x7fffffff7fffffff;
      auVar327._12_4_ = 0x7fffffff;
      auVar327._16_4_ = 0x7fffffff;
      auVar327._20_4_ = 0x7fffffff;
      auVar327._24_4_ = 0x7fffffff;
      auVar327._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(local_2c0,auVar327);
      auVar252 = vmaxps_avx(local_4c0,auVar100);
      auVar42._4_4_ = auVar252._4_4_ * 1.9073486e-06;
      auVar42._0_4_ = auVar252._0_4_ * 1.9073486e-06;
      auVar42._8_4_ = auVar252._8_4_ * 1.9073486e-06;
      auVar42._12_4_ = auVar252._12_4_ * 1.9073486e-06;
      auVar42._16_4_ = auVar252._16_4_ * 1.9073486e-06;
      auVar42._20_4_ = auVar252._20_4_ * 1.9073486e-06;
      auVar42._24_4_ = auVar252._24_4_ * 1.9073486e-06;
      auVar42._28_4_ = auVar252._28_4_;
      auVar100 = vandps_avx(local_4e0,auVar327);
      auVar100 = vcmpps_avx(auVar100,auVar42,1);
      auVar328._8_4_ = 0x7f800000;
      auVar328._0_8_ = 0x7f8000007f800000;
      auVar328._12_4_ = 0x7f800000;
      auVar328._16_4_ = 0x7f800000;
      auVar328._20_4_ = 0x7f800000;
      auVar328._24_4_ = 0x7f800000;
      auVar328._28_4_ = 0x7f800000;
      _local_b80 = vblendvps_avx(auVar328,auVar40,auVar9);
      local_680._4_4_ = fVar233 * (fVar259 + fStack_4fc * fVar232);
      local_680._0_4_ = fVar221 * (fVar247 + local_500 * fVar220);
      fStack_678 = fVar236 * (fVar262 + fStack_4f8 * fVar235);
      fStack_674 = fVar238 * (fVar266 + fStack_4f4 * fVar178);
      fStack_670 = fVar240 * (fVar270 + fStack_4f0 * fVar239);
      fStack_66c = fVar242 * (fVar274 + fStack_4ec * fVar241);
      fStack_668 = fVar244 * (fVar278 + fStack_4e8 * fVar243);
      fStack_664 = fVar281 + auVar252._28_4_;
      auVar226._8_4_ = 0xff800000;
      auVar226._0_8_ = 0xff800000ff800000;
      auVar226._12_4_ = 0xff800000;
      auVar226._16_4_ = 0xff800000;
      auVar226._20_4_ = 0xff800000;
      auVar226._24_4_ = 0xff800000;
      auVar226._28_4_ = 0xff800000;
      auVar385 = vblendvps_avx(auVar226,auVar41,auVar9);
      auVar252 = auVar9 & auVar100;
      if ((((((((auVar252 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar252 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar252 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar252 >> 0x7f,0) != '\0') ||
            (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar252 >> 0xbf,0) != '\0') ||
          (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar252[0x1f] < '\0') {
        auVar99 = vandps_avx(auVar100,auVar9);
        auVar167 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
        auVar15 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,2);
        auVar387._8_4_ = 0xff800000;
        auVar387._0_8_ = 0xff800000ff800000;
        auVar387._12_4_ = 0xff800000;
        auVar387._16_4_ = 0xff800000;
        auVar387._20_4_ = 0xff800000;
        auVar387._24_4_ = 0xff800000;
        auVar387._28_4_ = 0xff800000;
        auVar367._8_4_ = 0x7f800000;
        auVar367._0_8_ = 0x7f8000007f800000;
        auVar367._12_4_ = 0x7f800000;
        auVar367._16_4_ = 0x7f800000;
        auVar367._20_4_ = 0x7f800000;
        auVar367._24_4_ = 0x7f800000;
        auVar367._28_4_ = 0x7f800000;
        auVar100 = vblendvps_avx(auVar367,auVar387,auVar15);
        auVar114 = vpmovsxwd_avx(auVar167);
        auVar167 = vpunpckhwd_avx(auVar167,auVar167);
        auVar208._16_16_ = auVar167;
        auVar208._0_16_ = auVar114;
        _local_b80 = vblendvps_avx(_local_b80,auVar100,auVar208);
        auVar100 = vblendvps_avx(auVar387,auVar367,auVar15);
        auVar385 = vblendvps_avx(auVar385,auVar100,auVar208);
        auVar100 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar135._0_4_ = auVar99._0_4_ ^ auVar100._0_4_;
        auVar135._4_4_ = auVar99._4_4_ ^ auVar100._4_4_;
        auVar135._8_4_ = auVar99._8_4_ ^ auVar100._8_4_;
        auVar135._12_4_ = auVar99._12_4_ ^ auVar100._12_4_;
        auVar135._16_4_ = auVar99._16_4_ ^ auVar100._16_4_;
        auVar135._20_4_ = auVar99._20_4_ ^ auVar100._20_4_;
        auVar135._24_4_ = auVar99._24_4_ ^ auVar100._24_4_;
        auVar135._28_4_ = auVar99._28_4_ ^ auVar100._28_4_;
        auVar99 = vorps_avx(auVar15,auVar135);
        auVar99 = vandps_avx(auVar9,auVar99);
      }
    }
    auVar346 = ZEXT3264(auVar9);
    auVar332 = ZEXT3264(local_a00);
    auVar100 = local_4a0 & auVar99;
    if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0x7f,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar100 >> 0xbf,0) == '\0') &&
        (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar100[0x1f])
    {
      auVar339 = ZEXT3264(_local_820);
LAB_00e74bb7:
    }
    else {
      fStack_4e4 = fStack_7c4 + fVar218;
      local_530 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar167 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_));
      auVar167 = vshufps_avx(auVar167,auVar167,0);
      auVar207._16_16_ = auVar167;
      auVar207._0_16_ = auVar167;
      auVar9 = vminps_avx(auVar207,auVar385);
      fVar178 = auVar18._28_4_ + auVar19._28_4_;
      auVar149._0_4_ =
           (float)local_7e0._0_4_ * fVar245 +
           (float)local_800._0_4_ * fVar282 + fVar342 * (float)local_7c0._0_4_;
      auVar149._4_4_ =
           (float)local_7e0._4_4_ * fVar257 +
           (float)local_800._4_4_ * fVar287 + fVar348 * (float)local_7c0._4_4_;
      auVar149._8_4_ = fStack_7d8 * fVar260 + fStack_7f8 * fVar289 + fVar350 * fStack_7b8;
      auVar149._12_4_ = fStack_7d4 * fVar264 + fStack_7f4 * fVar291 + fVar352 * fStack_7b4;
      auVar149._16_4_ = fStack_7d0 * fVar268 + fStack_7f0 * fVar293 + fVar354 * fStack_7b0;
      auVar149._20_4_ = fStack_7cc * fVar272 + fStack_7ec * fVar295 + fVar356 * fStack_7ac;
      auVar149._24_4_ = fStack_7c8 * fVar276 + fStack_7e8 * fVar297 + fVar358 * fStack_7a8;
      auVar149._28_4_ = fVar178 + fVar299 + fVar178;
      auVar100 = vrcpps_avx(auVar149);
      fVar218 = auVar100._0_4_;
      fVar299 = auVar100._4_4_;
      auVar43._4_4_ = auVar149._4_4_ * fVar299;
      auVar43._0_4_ = auVar149._0_4_ * fVar218;
      fVar326 = auVar100._8_4_;
      auVar43._8_4_ = auVar149._8_4_ * fVar326;
      fVar333 = auVar100._12_4_;
      auVar43._12_4_ = auVar149._12_4_ * fVar333;
      fVar220 = auVar100._16_4_;
      auVar43._16_4_ = auVar149._16_4_ * fVar220;
      fVar232 = auVar100._20_4_;
      auVar43._20_4_ = auVar149._20_4_ * fVar232;
      fVar235 = auVar100._24_4_;
      auVar43._24_4_ = auVar149._24_4_ * fVar235;
      auVar43._28_4_ = fVar280;
      auVar366._8_4_ = 0x3f800000;
      auVar366._0_8_ = 0x3f8000003f800000;
      auVar366._12_4_ = 0x3f800000;
      auVar366._16_4_ = 0x3f800000;
      auVar366._20_4_ = 0x3f800000;
      auVar366._24_4_ = 0x3f800000;
      auVar366._28_4_ = 0x3f800000;
      auVar18 = vsubps_avx(auVar366,auVar43);
      auVar304._8_4_ = 0x7fffffff;
      auVar304._0_8_ = 0x7fffffff7fffffff;
      auVar304._12_4_ = 0x7fffffff;
      auVar304._16_4_ = 0x7fffffff;
      auVar304._20_4_ = 0x7fffffff;
      auVar304._24_4_ = 0x7fffffff;
      auVar304._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(auVar304,auVar149);
      auVar386._8_4_ = 0x219392ef;
      auVar386._0_8_ = 0x219392ef219392ef;
      auVar386._12_4_ = 0x219392ef;
      auVar386._16_4_ = 0x219392ef;
      auVar386._20_4_ = 0x219392ef;
      auVar386._24_4_ = 0x219392ef;
      auVar386._28_4_ = 0x219392ef;
      auVar15 = vcmpps_avx(auVar100,auVar386,1);
      auVar44._4_4_ =
           (fVar299 + fVar299 * auVar18._4_4_) *
           -(fVar257 * fVar194 + fVar287 * fVar193 + fVar348 * fVar237);
      auVar44._0_4_ =
           (fVar218 + fVar218 * auVar18._0_4_) *
           -(fVar245 * fVar177 + fVar282 * fVar213 + fVar342 * fVar176);
      auVar44._8_4_ =
           (fVar326 + fVar326 * auVar18._8_4_) *
           -(fVar260 * fVar214 + fVar289 * fVar212 + fVar350 * fVar210);
      auVar44._12_4_ =
           (fVar333 + fVar333 * auVar18._12_4_) *
           -(fVar264 * fVar308 + fVar291 * fVar305 + fVar352 * fVar300);
      auVar44._16_4_ =
           (fVar220 + fVar220 * auVar18._16_4_) *
           -(fVar268 * fVar340 + fVar293 * fVar334 + fVar354 * fVar320);
      auVar44._20_4_ =
           (fVar232 + fVar232 * auVar18._20_4_) *
           -(fVar272 * fVar355 + fVar295 * fVar353 + fVar356 * fVar351);
      auVar44._24_4_ =
           (fVar235 + fVar235 * auVar18._24_4_) *
           -(fVar276 * fVar383 + fVar297 * fVar369 + fVar358 * fVar378);
      auVar44._28_4_ = -(auVar20._28_4_ + fVar178);
      auVar100 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,1);
      auVar100 = vorps_avx(auVar15,auVar100);
      auVar329._8_4_ = 0xff800000;
      auVar329._0_8_ = 0xff800000ff800000;
      auVar329._12_4_ = 0xff800000;
      auVar329._16_4_ = 0xff800000;
      auVar329._20_4_ = 0xff800000;
      auVar329._24_4_ = 0xff800000;
      auVar329._28_4_ = 0xff800000;
      auVar332 = ZEXT3264(auVar329);
      auVar100 = vblendvps_avx(auVar44,auVar329,auVar100);
      auVar18 = vcmpps_avx(auVar149,ZEXT832(0) << 0x20,6);
      auVar15 = vorps_avx(auVar15,auVar18);
      auVar338._8_4_ = 0x7f800000;
      auVar338._0_8_ = 0x7f8000007f800000;
      auVar338._12_4_ = 0x7f800000;
      auVar338._16_4_ = 0x7f800000;
      auVar338._20_4_ = 0x7f800000;
      auVar338._24_4_ = 0x7f800000;
      auVar338._28_4_ = 0x7f800000;
      auVar15 = vblendvps_avx(auVar44,auVar338,auVar15);
      auVar18 = vmaxps_avx(local_2a0,_local_b80);
      auVar18 = vmaxps_avx(auVar18,auVar100);
      auVar19 = vminps_avx(auVar9,auVar15);
      auVar252 = ZEXT832(0) << 0x20;
      auVar100 = vsubps_avx(auVar252,auVar13);
      auVar15 = vsubps_avx(auVar252,_local_9a0);
      auVar45._4_4_ = auVar15._4_4_ * -fVar370;
      auVar45._0_4_ = auVar15._0_4_ * -fVar361;
      auVar45._8_4_ = auVar15._8_4_ * -fVar372;
      auVar45._12_4_ = auVar15._12_4_ * -fVar375;
      auVar45._16_4_ = auVar15._16_4_ * -fVar377;
      auVar45._20_4_ = auVar15._20_4_ * -fVar380;
      auVar45._24_4_ = auVar15._24_4_ * -fVar382;
      auVar45._28_4_ = auVar15._28_4_;
      auVar46._4_4_ = fVar288 * auVar100._4_4_;
      auVar46._0_4_ = fVar283 * auVar100._0_4_;
      auVar46._8_4_ = fVar290 * auVar100._8_4_;
      auVar46._12_4_ = fVar292 * auVar100._12_4_;
      auVar46._16_4_ = fVar294 * auVar100._16_4_;
      auVar46._20_4_ = fVar296 * auVar100._20_4_;
      auVar46._24_4_ = fVar298 * auVar100._24_4_;
      auVar46._28_4_ = auVar100._28_4_;
      auVar100 = vsubps_avx(auVar45,auVar46);
      auVar15 = vsubps_avx(auVar252,local_760);
      auVar47._4_4_ = fVar258 * auVar15._4_4_;
      auVar47._0_4_ = fVar246 * auVar15._0_4_;
      auVar47._8_4_ = fVar261 * auVar15._8_4_;
      auVar47._12_4_ = fVar265 * auVar15._12_4_;
      auVar47._16_4_ = fVar269 * auVar15._16_4_;
      auVar47._20_4_ = fVar273 * auVar15._20_4_;
      uVar1 = auVar15._28_4_;
      auVar47._24_4_ = fVar277 * auVar15._24_4_;
      auVar47._28_4_ = uVar1;
      auVar13 = vsubps_avx(auVar100,auVar47);
      auVar48._4_4_ = -fVar370 * (float)local_7c0._4_4_;
      auVar48._0_4_ = -fVar361 * (float)local_7c0._0_4_;
      auVar48._8_4_ = -fVar372 * fStack_7b8;
      auVar48._12_4_ = -fVar375 * fStack_7b4;
      auVar48._16_4_ = -fVar377 * fStack_7b0;
      auVar48._20_4_ = -fVar380 * fStack_7ac;
      auVar48._24_4_ = -fVar382 * fStack_7a8;
      auVar48._28_4_ = uVar75 ^ 0x80000000;
      auVar49._4_4_ = (float)local_800._4_4_ * fVar288;
      auVar49._0_4_ = (float)local_800._0_4_ * fVar283;
      auVar49._8_4_ = fStack_7f8 * fVar290;
      auVar49._12_4_ = fStack_7f4 * fVar292;
      auVar49._16_4_ = fStack_7f0 * fVar294;
      auVar49._20_4_ = fStack_7ec * fVar296;
      auVar49._24_4_ = fStack_7e8 * fVar298;
      auVar49._28_4_ = uVar1;
      auVar345._8_4_ = 0x3f800000;
      auVar345._0_8_ = 0x3f8000003f800000;
      auVar345._12_4_ = 0x3f800000;
      auVar345._16_4_ = 0x3f800000;
      auVar345._20_4_ = 0x3f800000;
      auVar345._24_4_ = 0x3f800000;
      auVar345._28_4_ = 0x3f800000;
      auVar346 = ZEXT3264(auVar345);
      auVar100 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = (float)local_7e0._4_4_ * fVar258;
      auVar50._0_4_ = (float)local_7e0._0_4_ * fVar246;
      auVar50._8_4_ = fStack_7d8 * fVar261;
      auVar50._12_4_ = fStack_7d4 * fVar265;
      auVar50._16_4_ = fStack_7d0 * fVar269;
      auVar50._20_4_ = fStack_7cc * fVar273;
      auVar50._24_4_ = fStack_7c8 * fVar277;
      auVar50._28_4_ = uVar1;
      auVar20 = vsubps_avx(auVar100,auVar50);
      auVar100 = vrcpps_avx(auVar20);
      fVar176 = auVar100._0_4_;
      fVar213 = auVar100._4_4_;
      auVar51._4_4_ = auVar20._4_4_ * fVar213;
      auVar51._0_4_ = auVar20._0_4_ * fVar176;
      fVar177 = auVar100._8_4_;
      auVar51._8_4_ = auVar20._8_4_ * fVar177;
      fVar237 = auVar100._12_4_;
      auVar51._12_4_ = auVar20._12_4_ * fVar237;
      fVar193 = auVar100._16_4_;
      auVar51._16_4_ = auVar20._16_4_ * fVar193;
      fVar194 = auVar100._20_4_;
      auVar51._20_4_ = auVar20._20_4_ * fVar194;
      fVar210 = auVar100._24_4_;
      auVar51._24_4_ = auVar20._24_4_ * fVar210;
      auVar51._28_4_ = fStack_7c4;
      auVar9 = vsubps_avx(auVar345,auVar51);
      auVar102._8_4_ = 0x7fffffff;
      auVar102._0_8_ = 0x7fffffff7fffffff;
      auVar102._12_4_ = 0x7fffffff;
      auVar102._16_4_ = 0x7fffffff;
      auVar102._20_4_ = 0x7fffffff;
      auVar102._24_4_ = 0x7fffffff;
      auVar102._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(auVar20,auVar102);
      auVar15 = vcmpps_avx(auVar100,auVar386,1);
      auVar52._4_4_ = (fVar213 + fVar213 * auVar9._4_4_) * -auVar13._4_4_;
      auVar52._0_4_ = (fVar176 + fVar176 * auVar9._0_4_) * -auVar13._0_4_;
      auVar52._8_4_ = (fVar177 + fVar177 * auVar9._8_4_) * -auVar13._8_4_;
      auVar52._12_4_ = (fVar237 + fVar237 * auVar9._12_4_) * -auVar13._12_4_;
      auVar52._16_4_ = (fVar193 + fVar193 * auVar9._16_4_) * -auVar13._16_4_;
      auVar52._20_4_ = (fVar194 + fVar194 * auVar9._20_4_) * -auVar13._20_4_;
      auVar52._24_4_ = (fVar210 + fVar210 * auVar9._24_4_) * -auVar13._24_4_;
      auVar52._28_4_ = auVar13._28_4_ ^ 0x80000000;
      auVar100 = vcmpps_avx(auVar20,auVar252,1);
      auVar100 = vorps_avx(auVar15,auVar100);
      auVar100 = vblendvps_avx(auVar52,auVar329,auVar100);
      _local_620 = vmaxps_avx(auVar18,auVar100);
      auVar100 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,6);
      auVar100 = vorps_avx(auVar15,auVar100);
      auVar100 = vblendvps_avx(auVar52,auVar338,auVar100);
      auVar99 = vandps_avx(auVar99,local_4a0);
      local_300 = vminps_avx(auVar19,auVar100);
      auVar100 = vcmpps_avx(_local_620,local_300,2);
      auVar15 = auVar99 & auVar100;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar15 >> 0x7f,0) == '\0') &&
            (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar15 >> 0xbf,0) == '\0') &&
          (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar15[0x1f])
      {
        auVar339 = ZEXT3264(_local_820);
        goto LAB_00e74bb7;
      }
      auVar18 = _local_620;
      auVar15 = vminps_avx(auVar206,auVar101);
      auVar13 = vminps_avx(auVar14,auVar16);
      auVar15 = vminps_avx(auVar15,auVar13);
      auVar15 = vsubps_avx(auVar15,_local_660);
      auVar332 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar99 = vandps_avx(auVar100,auVar99);
      auVar71._4_4_ = fStack_63c;
      auVar71._0_4_ = local_640;
      auVar71._8_4_ = fStack_638;
      auVar71._12_4_ = fStack_634;
      auVar71._16_4_ = fStack_630;
      auVar71._20_4_ = fStack_62c;
      auVar71._24_4_ = fStack_628;
      auVar71._28_4_ = fStack_624;
      auVar100 = vminps_avx(auVar71,auVar345);
      auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar82 + fVar113 * (auVar100._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar110 + fVar137 * (auVar100._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar111 + fVar138 * (auVar100._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar112 + fVar139 * (auVar100._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar82 + fVar113 * (auVar100._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar110 + fVar137 * (auVar100._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar111 + fVar138 * (auVar100._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar112 + auVar100._28_4_ + 7.0;
      auVar100 = vminps_avx(_local_680,auVar345);
      auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar82 + fVar113 * (auVar100._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar110 + fVar137 * (auVar100._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar111 + fVar138 * (auVar100._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar112 + fVar139 * (auVar100._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar82 + fVar113 * (auVar100._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar110 + fVar137 * (auVar100._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar111 + fVar138 * (auVar100._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar112 + auVar100._28_4_ + 7.0;
      auVar53._4_4_ = auVar15._4_4_ * 0.99999976;
      auVar53._0_4_ = auVar15._0_4_ * 0.99999976;
      auVar53._8_4_ = auVar15._8_4_ * 0.99999976;
      auVar53._12_4_ = auVar15._12_4_ * 0.99999976;
      auVar53._16_4_ = auVar15._16_4_ * 0.99999976;
      auVar53._20_4_ = auVar15._20_4_ * 0.99999976;
      auVar53._24_4_ = auVar15._24_4_ * 0.99999976;
      auVar53._28_4_ = 0x3f7ffffc;
      auVar100 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar53);
      auVar54._4_4_ = auVar100._4_4_ * auVar100._4_4_;
      auVar54._0_4_ = auVar100._0_4_ * auVar100._0_4_;
      auVar54._8_4_ = auVar100._8_4_ * auVar100._8_4_;
      auVar54._12_4_ = auVar100._12_4_ * auVar100._12_4_;
      auVar54._16_4_ = auVar100._16_4_ * auVar100._16_4_;
      auVar54._20_4_ = auVar100._20_4_ * auVar100._20_4_;
      auVar54._24_4_ = auVar100._24_4_ * auVar100._24_4_;
      auVar54._28_4_ = auVar100._28_4_;
      auVar15 = vsubps_avx(auVar21,auVar54);
      auVar55._4_4_ = auVar15._4_4_ * (float)local_5a0._4_4_;
      auVar55._0_4_ = auVar15._0_4_ * (float)local_5a0._0_4_;
      auVar55._8_4_ = auVar15._8_4_ * fStack_598;
      auVar55._12_4_ = auVar15._12_4_ * fStack_594;
      auVar55._16_4_ = auVar15._16_4_ * fStack_590;
      auVar55._20_4_ = auVar15._20_4_ * fStack_58c;
      auVar55._24_4_ = auVar15._24_4_ * fStack_588;
      auVar55._28_4_ = auVar100._28_4_;
      auVar13 = vsubps_avx(local_580,auVar55);
      auVar100 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0x7f,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0xbf,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar100[0x1f]) {
        _local_860 = ZEXT832(0) << 0x20;
        _local_880 = ZEXT832(0) << 0x20;
        auVar285 = ZEXT864(0) << 0x20;
        auVar187 = ZEXT828(0) << 0x20;
        auVar227._8_4_ = 0x7f800000;
        auVar227._0_8_ = 0x7f8000007f800000;
        auVar227._12_4_ = 0x7f800000;
        auVar227._16_4_ = 0x7f800000;
        auVar227._20_4_ = 0x7f800000;
        auVar227._24_4_ = 0x7f800000;
        auVar227._28_4_ = 0x7f800000;
        auVar253._8_4_ = 0xff800000;
        auVar253._0_8_ = 0xff800000ff800000;
        auVar253._12_4_ = 0xff800000;
        auVar253._16_4_ = 0xff800000;
        auVar253._20_4_ = 0xff800000;
        auVar253._24_4_ = 0xff800000;
        auVar253._28_4_ = 0xff800000;
        _local_840 = _local_860;
      }
      else {
        auVar16 = vsqrtps_avx(auVar13);
        auVar172._0_4_ = fVar371 + fVar371;
        auVar172._4_4_ = fVar374 + fVar374;
        auVar172._8_4_ = fVar376 + fVar376;
        auVar172._12_4_ = fVar379 + fVar379;
        auVar172._16_4_ = fVar381 + fVar381;
        auVar172._20_4_ = fVar140 + fVar140;
        auVar172._24_4_ = fVar323 + fVar323;
        auVar172._28_4_ = fVar156 + fVar156;
        auVar14 = vrcpps_avx(auVar172);
        fVar156 = auVar14._0_4_;
        fVar176 = auVar14._4_4_;
        auVar56._4_4_ = auVar172._4_4_ * fVar176;
        auVar56._0_4_ = auVar172._0_4_ * fVar156;
        fVar213 = auVar14._8_4_;
        auVar56._8_4_ = auVar172._8_4_ * fVar213;
        fVar177 = auVar14._12_4_;
        auVar56._12_4_ = auVar172._12_4_ * fVar177;
        fVar237 = auVar14._16_4_;
        auVar56._16_4_ = auVar172._16_4_ * fVar237;
        fVar193 = auVar14._20_4_;
        auVar56._20_4_ = auVar172._20_4_ * fVar193;
        fVar194 = auVar14._24_4_;
        auVar56._24_4_ = auVar172._24_4_ * fVar194;
        auVar56._28_4_ = auVar172._28_4_;
        auVar19 = vsubps_avx(auVar345,auVar56);
        fVar156 = fVar156 + fVar156 * auVar19._0_4_;
        fVar176 = fVar176 + fVar176 * auVar19._4_4_;
        fVar213 = fVar213 + fVar213 * auVar19._8_4_;
        fVar177 = fVar177 + fVar177 * auVar19._12_4_;
        fVar237 = fVar237 + fVar237 * auVar19._16_4_;
        fVar193 = fVar193 + fVar193 * auVar19._20_4_;
        fVar194 = fVar194 + fVar194 * auVar19._24_4_;
        fVar210 = auVar14._28_4_ + auVar19._28_4_;
        auVar189._0_8_ = local_a00._0_8_ ^ 0x8000000080000000;
        auVar189._8_4_ = -local_a00._8_4_;
        auVar189._12_4_ = -local_a00._12_4_;
        auVar189._16_4_ = -local_a00._16_4_;
        auVar189._20_4_ = -local_a00._20_4_;
        auVar189._24_4_ = -local_a00._24_4_;
        auVar189._28_4_ = -local_a00._28_4_;
        auVar14 = vsubps_avx(auVar189,auVar16);
        fVar340 = auVar14._0_4_ * fVar156;
        fVar351 = auVar14._4_4_ * fVar176;
        auVar57._4_4_ = fVar351;
        auVar57._0_4_ = fVar340;
        fVar353 = auVar14._8_4_ * fVar213;
        auVar57._8_4_ = fVar353;
        fVar355 = auVar14._12_4_ * fVar177;
        auVar57._12_4_ = fVar355;
        fVar378 = auVar14._16_4_ * fVar237;
        auVar57._16_4_ = fVar378;
        fVar369 = auVar14._20_4_ * fVar193;
        auVar57._20_4_ = fVar369;
        fVar383 = auVar14._24_4_ * fVar194;
        auVar57._24_4_ = fVar383;
        auVar57._28_4_ = fVar373;
        auVar16 = vsubps_avx(auVar16,local_a00);
        fVar156 = auVar16._0_4_ * fVar156;
        fVar176 = auVar16._4_4_ * fVar176;
        auVar58._4_4_ = fVar176;
        auVar58._0_4_ = fVar156;
        fVar213 = auVar16._8_4_ * fVar213;
        auVar58._8_4_ = fVar213;
        fVar177 = auVar16._12_4_ * fVar177;
        auVar58._12_4_ = fVar177;
        fVar237 = auVar16._16_4_ * fVar237;
        auVar58._16_4_ = fVar237;
        fVar193 = auVar16._20_4_ * fVar193;
        auVar58._20_4_ = fVar193;
        fVar194 = auVar16._24_4_ * fVar194;
        auVar58._24_4_ = fVar194;
        auVar58._28_4_ = 0x3f800000;
        auVar346 = ZEXT3264(auVar58);
        local_2e0 = auVar17;
        fVar212 = fVar221 * (fVar340 * local_500 + fVar247);
        fVar214 = fVar233 * (fVar351 * fStack_4fc + fVar259);
        fVar300 = fVar236 * (fVar353 * fStack_4f8 + fVar262);
        fVar305 = fVar238 * (fVar355 * fStack_4f4 + fVar266);
        fVar308 = fVar240 * (fVar378 * fStack_4f0 + fVar270);
        fVar320 = fVar242 * (fVar369 * fStack_4ec + fVar274);
        fVar334 = fVar244 * (fVar383 * fStack_4e8 + fVar278);
        auVar129._0_4_ = fVar301 + fVar211 * fVar212;
        auVar129._4_4_ = fVar306 + fVar234 * fVar214;
        auVar129._8_4_ = fVar309 + fVar198 * fVar300;
        auVar129._12_4_ = fVar312 + fVar217 * fVar305;
        auVar129._16_4_ = fVar315 + fVar317 * fVar308;
        auVar129._20_4_ = fVar318 + fVar349 * fVar320;
        auVar129._24_4_ = fVar321 + fVar360 * fVar334;
        auVar129._28_4_ = fVar324 + auVar16._28_4_ + fVar281;
        auVar59._4_4_ = (float)local_7e0._4_4_ * fVar351;
        auVar59._0_4_ = (float)local_7e0._0_4_ * fVar340;
        auVar59._8_4_ = fStack_7d8 * fVar353;
        auVar59._12_4_ = fStack_7d4 * fVar355;
        auVar59._16_4_ = fStack_7d0 * fVar378;
        auVar59._20_4_ = fStack_7cc * fVar369;
        auVar59._24_4_ = fStack_7c8 * fVar383;
        auVar59._28_4_ = fVar210;
        auVar16 = vsubps_avx(auVar59,auVar129);
        auVar173._0_4_ = fVar302 + fVar209 * fVar212;
        auVar173._4_4_ = fVar307 + fVar219 * fVar214;
        auVar173._8_4_ = fVar310 + fVar195 * fVar300;
        auVar173._12_4_ = fVar313 + fVar215 * fVar305;
        auVar173._16_4_ = fVar316 + fVar311 * fVar308;
        auVar173._20_4_ = fVar319 + fVar341 * fVar320;
        auVar173._24_4_ = fVar322 + fVar357 * fVar334;
        auVar173._28_4_ = fVar325 + fVar210;
        auVar228._0_4_ = fVar340 * (float)local_800._0_4_;
        auVar228._4_4_ = fVar351 * (float)local_800._4_4_;
        auVar228._8_4_ = fVar353 * fStack_7f8;
        auVar228._12_4_ = fVar355 * fStack_7f4;
        auVar228._16_4_ = fVar378 * fStack_7f0;
        auVar228._20_4_ = fVar369 * fStack_7ec;
        auVar228._24_4_ = fVar383 * fStack_7e8;
        auVar228._28_4_ = 0;
        _local_9a0 = vsubps_avx(auVar228,auVar173);
        auVar190._0_4_ = local_920 + fVar175 * fVar212;
        auVar190._4_4_ = fStack_91c + fVar231 * fVar214;
        auVar190._8_4_ = fStack_918 + fVar196 * fVar300;
        auVar190._12_4_ = fStack_914 + fVar216 * fVar305;
        auVar190._16_4_ = fStack_910 + fVar314 * fVar308;
        auVar190._20_4_ = fStack_90c + fVar347 * fVar320;
        auVar190._24_4_ = fStack_908 + fVar359 * fVar334;
        auVar190._28_4_ = fStack_904 + auVar14._28_4_;
        auVar60._4_4_ = fVar351 * (float)local_7c0._4_4_;
        auVar60._0_4_ = fVar340 * (float)local_7c0._0_4_;
        auVar60._8_4_ = fVar353 * fStack_7b8;
        auVar60._12_4_ = fVar355 * fStack_7b4;
        auVar60._16_4_ = fVar378 * fStack_7b0;
        auVar60._20_4_ = fVar369 * fStack_7ac;
        auVar60._24_4_ = fVar383 * fStack_7a8;
        auVar60._28_4_ = 0;
        auVar14 = vsubps_avx(auVar60,auVar190);
        auVar187 = auVar14._0_28_;
        fVar221 = (fVar156 * local_500 + fVar247) * fVar221;
        fVar233 = (fVar176 * fStack_4fc + fVar259) * fVar233;
        fVar236 = (fVar213 * fStack_4f8 + fVar262) * fVar236;
        fVar238 = (fVar177 * fStack_4f4 + fVar266) * fVar238;
        fVar240 = (fVar237 * fStack_4f0 + fVar270) * fVar240;
        fVar242 = (fVar193 * fStack_4ec + fVar274) * fVar242;
        fVar244 = (fVar194 * fStack_4e8 + fVar278) * fVar244;
        auVar254._0_4_ = fVar301 + fVar211 * fVar221;
        auVar254._4_4_ = fVar306 + fVar234 * fVar233;
        auVar254._8_4_ = fVar309 + fVar198 * fVar236;
        auVar254._12_4_ = fVar312 + fVar217 * fVar238;
        auVar254._16_4_ = fVar315 + fVar317 * fVar240;
        auVar254._20_4_ = fVar318 + fVar349 * fVar242;
        auVar254._24_4_ = fVar321 + fVar360 * fVar244;
        auVar254._28_4_ = fVar324 + (float)local_600._28_4_;
        auVar61._4_4_ = (float)local_7e0._4_4_ * fVar176;
        auVar61._0_4_ = (float)local_7e0._0_4_ * fVar156;
        auVar61._8_4_ = fStack_7d8 * fVar213;
        auVar61._12_4_ = fStack_7d4 * fVar177;
        auVar61._16_4_ = fStack_7d0 * fVar237;
        auVar61._20_4_ = fStack_7cc * fVar193;
        auVar61._24_4_ = fStack_7c8 * fVar194;
        auVar61._28_4_ = fVar324;
        _local_840 = vsubps_avx(auVar61,auVar254);
        auVar255._0_4_ = fVar302 + fVar209 * fVar221;
        auVar255._4_4_ = fVar307 + fVar219 * fVar233;
        auVar255._8_4_ = fVar310 + fVar195 * fVar236;
        auVar255._12_4_ = fVar313 + fVar215 * fVar238;
        auVar255._16_4_ = fVar316 + fVar311 * fVar240;
        auVar255._20_4_ = fVar319 + fVar341 * fVar242;
        auVar255._24_4_ = fVar322 + fVar357 * fVar244;
        auVar255._28_4_ = fVar325 + local_840._28_4_;
        auVar62._4_4_ = fVar176 * (float)local_800._4_4_;
        auVar62._0_4_ = fVar156 * (float)local_800._0_4_;
        auVar62._8_4_ = fVar213 * fStack_7f8;
        auVar62._12_4_ = fVar177 * fStack_7f4;
        auVar62._16_4_ = fVar237 * fStack_7f0;
        auVar62._20_4_ = fVar193 * fStack_7ec;
        auVar62._24_4_ = fVar194 * fStack_7e8;
        auVar62._28_4_ = fVar324;
        _local_860 = vsubps_avx(auVar62,auVar255);
        auVar229._0_4_ = local_920 + fVar175 * fVar221;
        auVar229._4_4_ = fStack_91c + fVar231 * fVar233;
        auVar229._8_4_ = fStack_918 + fVar196 * fVar236;
        auVar229._12_4_ = fStack_914 + fVar216 * fVar238;
        auVar229._16_4_ = fStack_910 + fVar314 * fVar240;
        auVar229._20_4_ = fStack_90c + fVar347 * fVar242;
        auVar229._24_4_ = fStack_908 + fVar359 * fVar244;
        auVar229._28_4_ = fStack_904 + fVar281 + 0.0;
        auVar63._4_4_ = fVar176 * (float)local_7c0._4_4_;
        auVar63._0_4_ = fVar156 * (float)local_7c0._0_4_;
        auVar63._8_4_ = fVar213 * fStack_7b8;
        auVar63._12_4_ = fVar177 * fStack_7b4;
        auVar63._16_4_ = fVar237 * fStack_7b0;
        auVar63._20_4_ = fVar193 * fStack_7ac;
        auVar63._24_4_ = fVar194 * fStack_7a8;
        auVar63._28_4_ = auVar255._28_4_;
        _local_880 = vsubps_avx(auVar63,auVar229);
        auVar14 = vcmpps_avx(auVar13,_DAT_01faff00,5);
        auVar230._8_4_ = 0x7f800000;
        auVar230._0_8_ = 0x7f8000007f800000;
        auVar230._12_4_ = 0x7f800000;
        auVar230._16_4_ = 0x7f800000;
        auVar230._20_4_ = 0x7f800000;
        auVar230._24_4_ = 0x7f800000;
        auVar230._28_4_ = 0x7f800000;
        auVar227 = vblendvps_avx(auVar230,auVar57,auVar14);
        auVar330._8_4_ = 0x7fffffff;
        auVar330._0_8_ = 0x7fffffff7fffffff;
        auVar330._12_4_ = 0x7fffffff;
        auVar330._16_4_ = 0x7fffffff;
        auVar330._20_4_ = 0x7fffffff;
        auVar330._24_4_ = 0x7fffffff;
        auVar330._28_4_ = 0x7fffffff;
        auVar13 = vandps_avx(auVar330,local_2c0);
        auVar13 = vmaxps_avx(local_4c0,auVar13);
        auVar64._4_4_ = auVar13._4_4_ * 1.9073486e-06;
        auVar64._0_4_ = auVar13._0_4_ * 1.9073486e-06;
        auVar64._8_4_ = auVar13._8_4_ * 1.9073486e-06;
        auVar64._12_4_ = auVar13._12_4_ * 1.9073486e-06;
        auVar64._16_4_ = auVar13._16_4_ * 1.9073486e-06;
        auVar64._20_4_ = auVar13._20_4_ * 1.9073486e-06;
        auVar64._24_4_ = auVar13._24_4_ * 1.9073486e-06;
        auVar64._28_4_ = auVar13._28_4_;
        auVar13 = vandps_avx(auVar330,local_4e0);
        auVar13 = vcmpps_avx(auVar13,auVar64,1);
        auVar256._8_4_ = 0xff800000;
        auVar256._0_8_ = 0xff800000ff800000;
        auVar256._12_4_ = 0xff800000;
        auVar256._16_4_ = 0xff800000;
        auVar256._20_4_ = 0xff800000;
        auVar256._24_4_ = 0xff800000;
        auVar256._28_4_ = 0xff800000;
        auVar253 = vblendvps_avx(auVar256,auVar58,auVar14);
        auVar17 = auVar14 & auVar13;
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0x7f,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0xbf,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar17[0x1f] < '\0') {
          auVar100 = vandps_avx(auVar13,auVar14);
          auVar167 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
          auVar13 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,2);
          auVar388._8_4_ = 0xff800000;
          auVar388._0_8_ = 0xff800000ff800000;
          auVar388._12_4_ = 0xff800000;
          auVar388._16_4_ = 0xff800000;
          auVar388._20_4_ = 0xff800000;
          auVar388._24_4_ = 0xff800000;
          auVar388._28_4_ = 0xff800000;
          auVar368._8_4_ = 0x7f800000;
          auVar368._0_8_ = 0x7f8000007f800000;
          auVar368._12_4_ = 0x7f800000;
          auVar368._16_4_ = 0x7f800000;
          auVar368._20_4_ = 0x7f800000;
          auVar368._24_4_ = 0x7f800000;
          auVar368._28_4_ = 0x7f800000;
          auVar15 = vblendvps_avx(auVar368,auVar388,auVar13);
          auVar114 = vpmovsxwd_avx(auVar167);
          auVar346 = ZEXT1664(auVar114);
          auVar167 = vpunpckhwd_avx(auVar167,auVar167);
          auVar331._16_16_ = auVar167;
          auVar331._0_16_ = auVar114;
          auVar227 = vblendvps_avx(auVar227,auVar15,auVar331);
          auVar15 = vblendvps_avx(auVar388,auVar368,auVar13);
          auVar253 = vblendvps_avx(auVar253,auVar15,auVar331);
          auVar15 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          auVar109._0_4_ = auVar15._0_4_ ^ auVar100._0_4_;
          auVar109._4_4_ = auVar15._4_4_ ^ auVar100._4_4_;
          auVar109._8_4_ = auVar15._8_4_ ^ auVar100._8_4_;
          auVar109._12_4_ = auVar15._12_4_ ^ auVar100._12_4_;
          auVar109._16_4_ = auVar15._16_4_ ^ auVar100._16_4_;
          auVar109._20_4_ = auVar15._20_4_ ^ auVar100._20_4_;
          auVar109._24_4_ = auVar15._24_4_ ^ auVar100._24_4_;
          auVar109._28_4_ = auVar15._28_4_ ^ auVar100._28_4_;
          auVar100 = vorps_avx(auVar13,auVar109);
          auVar100 = vandps_avx(auVar14,auVar100);
        }
        auVar285 = ZEXT3264(auVar16);
        auVar332 = ZEXT3264(_local_9a0);
      }
      _local_360 = _local_620;
      local_340 = vminps_avx(local_300,auVar227);
      local_320 = vmaxps_avx(_local_620,auVar253);
      auVar15 = vcmpps_avx(_local_620,local_340,2);
      local_580 = vandps_avx(auVar99,auVar15);
      auVar15 = vcmpps_avx(local_320,local_300,2);
      local_5c0 = vandps_avx(auVar99,auVar15);
      auVar99 = vorps_avx(local_5c0,local_580);
      auVar339 = ZEXT3264(_local_820);
      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0x7f,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar99 >> 0xbf,0) != '\0') ||
          (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar99[0x1f] < '\0') {
        _local_660 = local_320;
        auVar15 = _local_660;
        _local_680 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_5e0._0_4_ = auVar100._0_4_ ^ local_680._0_4_;
        local_5e0._4_4_ = auVar100._4_4_ ^ local_680._4_4_;
        local_5e0._8_4_ = auVar100._8_4_ ^ local_680._8_4_;
        local_5e0._12_4_ = auVar100._12_4_ ^ local_680._12_4_;
        local_5e0._16_4_ = auVar100._16_4_ ^ local_680._16_4_;
        local_5e0._20_4_ = auVar100._20_4_ ^ local_680._20_4_;
        local_5e0._24_4_ = auVar100._24_4_ ^ local_680._24_4_;
        local_5e0._28_4_ = (uint)auVar100._28_4_ ^ (uint)local_680._28_4_;
        auVar105._0_4_ =
             auVar285._0_4_ * (float)local_7e0._0_4_ +
             auVar332._0_4_ * (float)local_800._0_4_ + (float)local_7c0._0_4_ * auVar187._0_4_;
        auVar105._4_4_ =
             auVar285._4_4_ * (float)local_7e0._4_4_ +
             auVar332._4_4_ * (float)local_800._4_4_ + (float)local_7c0._4_4_ * auVar187._4_4_;
        auVar105._8_4_ =
             auVar285._8_4_ * fStack_7d8 + auVar332._8_4_ * fStack_7f8 + fStack_7b8 * auVar187._8_4_
        ;
        auVar105._12_4_ =
             auVar285._12_4_ * fStack_7d4 +
             auVar332._12_4_ * fStack_7f4 + fStack_7b4 * auVar187._12_4_;
        auVar105._16_4_ =
             auVar285._16_4_ * fStack_7d0 +
             auVar332._16_4_ * fStack_7f0 + fStack_7b0 * auVar187._16_4_;
        auVar105._20_4_ =
             auVar285._20_4_ * fStack_7cc +
             auVar332._20_4_ * fStack_7ec + fStack_7ac * auVar187._20_4_;
        auVar105._24_4_ =
             auVar285._24_4_ * fStack_7c8 +
             auVar332._24_4_ * fStack_7e8 + fStack_7a8 * auVar187._24_4_;
        auVar105._28_4_ = auVar100._28_4_ + local_680._28_4_ + 0.0;
        auVar130._8_4_ = 0x7fffffff;
        auVar130._0_8_ = 0x7fffffff7fffffff;
        auVar130._12_4_ = 0x7fffffff;
        auVar130._16_4_ = 0x7fffffff;
        auVar130._20_4_ = 0x7fffffff;
        auVar130._24_4_ = 0x7fffffff;
        auVar130._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar105,auVar130);
        auVar131._8_4_ = 0x3e99999a;
        auVar131._0_8_ = 0x3e99999a3e99999a;
        auVar131._12_4_ = 0x3e99999a;
        auVar131._16_4_ = 0x3e99999a;
        auVar131._20_4_ = 0x3e99999a;
        auVar131._24_4_ = 0x3e99999a;
        auVar131._28_4_ = 0x3e99999a;
        auVar99 = vcmpps_avx(auVar99,auVar131,1);
        auVar99 = vorps_avx(auVar99,local_5e0);
        auVar132._8_4_ = 3;
        auVar132._0_8_ = 0x300000003;
        auVar132._12_4_ = 3;
        auVar132._16_4_ = 3;
        auVar132._20_4_ = 3;
        auVar132._24_4_ = 3;
        auVar132._28_4_ = 3;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar99 = vblendvps_avx(auVar150,auVar132,auVar99);
        local_600 = ZEXT432(local_c28);
        auVar114 = vpshufd_avx(ZEXT416(local_c28),0);
        auVar167 = vpcmpgtd_avx(auVar99._16_16_,auVar114);
        local_640 = auVar114._0_4_;
        fStack_63c = auVar114._4_4_;
        fStack_638 = auVar114._8_4_;
        fStack_634 = auVar114._12_4_;
        auVar114 = vpcmpgtd_avx(auVar99._0_16_,auVar114);
        auVar133._16_16_ = auVar167;
        auVar133._0_16_ = auVar114;
        _local_5a0 = vblendps_avx(ZEXT1632(auVar114),auVar133,0xf0);
        local_560 = vandnps_avx(_local_5a0,local_580);
        auVar285 = ZEXT3264(local_560);
        auVar99 = local_580 & ~_local_5a0;
        local_a70 = auVar84._0_4_;
        fStack_a6c = auVar84._4_4_;
        fStack_a68 = auVar84._8_4_;
        fStack_a64 = auVar84._12_4_;
        local_a50 = auVar12._0_4_;
        fStack_a4c = auVar12._4_4_;
        fStack_a48 = auVar12._8_4_;
        fStack_a44 = auVar12._12_4_;
        local_a60 = auVar83._0_4_;
        fStack_a5c = auVar83._4_4_;
        fStack_a58 = auVar83._8_4_;
        fStack_a54 = auVar83._12_4_;
        local_a40 = auVar11._0_4_;
        fStack_a3c = auVar11._4_4_;
        fStack_a38 = auVar11._8_4_;
        fStack_a34 = auVar11._12_4_;
        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar99 >> 0x7f,0) == '\0') &&
              (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar99 >> 0xbf,0) == '\0') &&
            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar99[0x1f]) {
          auVar167 = vshufps_avx(local_530,local_530,0);
          auVar106._16_16_ = auVar167;
          auVar106._0_16_ = auVar167;
          local_660._0_4_ = local_320._0_4_;
          local_660._4_4_ = local_320._4_4_;
          fStack_658 = local_320._8_4_;
          fStack_654 = local_320._12_4_;
          fStack_650 = local_320._16_4_;
          fStack_64c = local_320._20_4_;
          fStack_648 = local_320._24_4_;
          fStack_644 = local_320._28_4_;
          auVar187 = local_7e0._0_28_;
          fVar156 = (float)local_660._0_4_;
          fVar209 = (float)local_660._4_4_;
          fVar175 = fStack_658;
          fVar211 = fStack_654;
          fVar176 = fStack_650;
          fVar213 = fStack_64c;
          fVar177 = fStack_648;
          fVar219 = fStack_644;
          _local_660 = auVar15;
        }
        else {
          local_940._4_4_ = (float)local_620._4_4_ + (float)local_9e0._4_4_;
          local_940._0_4_ = (float)local_620._0_4_ + (float)local_9e0._0_4_;
          fStack_938 = fStack_618 + fStack_9d8;
          fStack_934 = fStack_614 + fStack_9d4;
          fStack_930 = fStack_610 + fStack_9d0;
          fStack_92c = fStack_60c + fStack_9cc;
          fStack_928 = fStack_608 + fStack_9c8;
          fStack_924 = fStack_604 + fStack_9c4;
          _local_620 = auVar18;
          do {
            auVar107._8_4_ = 0x7f800000;
            auVar107._0_8_ = 0x7f8000007f800000;
            auVar107._12_4_ = 0x7f800000;
            auVar107._16_4_ = 0x7f800000;
            auVar107._20_4_ = 0x7f800000;
            auVar107._24_4_ = 0x7f800000;
            auVar107._28_4_ = 0x7f800000;
            auVar99 = auVar285._0_32_;
            auVar100 = vblendvps_avx(auVar107,_local_620,auVar99);
            auVar15 = vshufps_avx(auVar100,auVar100,0xb1);
            auVar15 = vminps_avx(auVar100,auVar15);
            auVar13 = vshufpd_avx(auVar15,auVar15,5);
            auVar15 = vminps_avx(auVar15,auVar13);
            auVar13 = vperm2f128_avx(auVar15,auVar15,1);
            auVar15 = vminps_avx(auVar15,auVar13);
            auVar100 = vcmpps_avx(auVar100,auVar15,0);
            auVar15 = auVar99 & auVar100;
            if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0x7f,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0xbf,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar15[0x1f] < '\0') {
              auVar99 = vandps_avx(auVar100,auVar99);
            }
            uVar73 = vmovmskps_avx(auVar99);
            uVar75 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> uVar75 & 1) == 0; uVar75 = uVar75 + 1) {
              }
            }
            uVar78 = (ulong)uVar75;
            *(undefined4 *)(local_560 + uVar78 * 4) = 0;
            fVar156 = local_1a0[uVar78];
            uVar75 = *(uint *)(local_360 + uVar78 * 4);
            fVar209 = auVar115._0_4_;
            if ((float)local_960._0_4_ < 0.0) {
              fVar209 = sqrtf((float)local_960._0_4_);
            }
            auVar114 = vminps_avx(auVar11,auVar83);
            auVar167 = vmaxps_avx(auVar11,auVar83);
            auVar88 = vminps_avx(auVar12,auVar84);
            auVar94 = vminps_avx(auVar114,auVar88);
            auVar114 = vmaxps_avx(auVar12,auVar84);
            auVar88 = vmaxps_avx(auVar167,auVar114);
            auVar159._8_4_ = 0x7fffffff;
            auVar159._0_8_ = 0x7fffffff7fffffff;
            auVar159._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar94,auVar159);
            auVar114 = vandps_avx(auVar88,auVar159);
            auVar167 = vmaxps_avx(auVar167,auVar114);
            auVar114 = vmovshdup_avx(auVar167);
            auVar114 = vmaxss_avx(auVar114,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar114);
            local_920 = auVar167._0_4_ * 1.9073486e-06;
            local_760._0_4_ = fVar209 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar88,auVar88,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar75),ZEXT416((uint)fVar156),0x10);
            auVar332 = ZEXT1664(auVar167);
            lVar77 = 5;
            do {
              auVar141 = auVar332._0_16_;
              auVar167 = vshufps_avx(auVar141,auVar141,0);
              auVar87._0_4_ = auVar167._0_4_ * (float)local_950._0_4_ + 0.0;
              auVar87._4_4_ = auVar167._4_4_ * (float)local_950._4_4_ + 0.0;
              auVar87._8_4_ = auVar167._8_4_ * fStack_948 + 0.0;
              auVar87._12_4_ = auVar167._12_4_ * fStack_944 + 0.0;
              auVar167 = vmovshdup_avx(auVar141);
              fVar176 = auVar167._0_4_;
              fVar175 = 1.0 - fVar176;
              fVar209 = fVar176 * 3.0;
              fVar156 = fVar209 + -5.0;
              auVar167 = ZEXT416((uint)(fVar176 * fVar176 * -fVar175 * 0.5));
              auVar167 = vshufps_avx(auVar167,auVar167,0);
              auVar114 = ZEXT416((uint)((fVar175 * fVar175 * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar88 = ZEXT416((uint)((fVar176 * fVar176 * fVar156 + 2.0) * 0.5));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar94 = ZEXT416((uint)(fVar175 * fVar175 * -fVar176 * 0.5));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar142._0_4_ =
                   auVar94._0_4_ * local_a40 +
                   auVar88._0_4_ * local_a60 +
                   auVar114._0_4_ * local_a50 + auVar167._0_4_ * local_a70;
              auVar142._4_4_ =
                   auVar94._4_4_ * fStack_a3c +
                   auVar88._4_4_ * fStack_a5c +
                   auVar114._4_4_ * fStack_a4c + auVar167._4_4_ * fStack_a6c;
              auVar142._8_4_ =
                   auVar94._8_4_ * fStack_a38 +
                   auVar88._8_4_ * fStack_a58 +
                   auVar114._8_4_ * fStack_a48 + auVar167._8_4_ * fStack_a68;
              auVar142._12_4_ =
                   auVar94._12_4_ * fStack_a34 +
                   auVar88._12_4_ * fStack_a54 +
                   auVar114._12_4_ * fStack_a44 + auVar167._12_4_ * fStack_a64;
              _local_9a0 = auVar142;
              auVar114 = vsubps_avx(auVar87,auVar142);
              auVar167 = vdpps_avx(auVar114,auVar114,0x7f);
              fVar211 = auVar167._0_4_;
              if (fVar211 < 0.0) {
                local_980._0_4_ = fVar209;
                local_a00._0_4_ = fVar156;
                local_780._0_4_ = fVar175 * -2.0;
                auVar285._0_4_ = sqrtf(fVar211);
                auVar285._4_60_ = extraout_var;
                auVar88 = auVar285._0_16_;
                fVar156 = (float)local_a00._0_4_;
                fVar213 = (float)local_780._0_4_;
                fVar177 = (float)local_980._0_4_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar167,auVar167);
                fVar213 = fVar175 * -2.0;
                fVar177 = fVar209;
              }
              auVar346 = ZEXT1664(auVar88);
              auVar94 = ZEXT416((uint)((fVar176 * fVar176 + fVar176 * fVar213) * 0.5));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar89 = ZEXT416((uint)(((fVar175 + fVar175) * (fVar177 + 2.0) +
                                       fVar175 * fVar175 * -3.0) * 0.5));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar122 = ZEXT416((uint)((fVar156 * (fVar176 + fVar176) + fVar176 * fVar177) * 0.5));
              auVar122 = vshufps_avx(auVar122,auVar122,0);
              auVar116 = ZEXT416((uint)((fVar176 * (fVar175 + fVar175) - fVar175 * fVar175) * 0.5));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar336._0_4_ =
                   local_a40 * auVar116._0_4_ +
                   local_a60 * auVar122._0_4_ +
                   local_a70 * auVar94._0_4_ + local_a50 * auVar89._0_4_;
              auVar336._4_4_ =
                   fStack_a3c * auVar116._4_4_ +
                   fStack_a5c * auVar122._4_4_ +
                   fStack_a6c * auVar94._4_4_ + fStack_a4c * auVar89._4_4_;
              auVar336._8_4_ =
                   fStack_a38 * auVar116._8_4_ +
                   fStack_a58 * auVar122._8_4_ +
                   fStack_a68 * auVar94._8_4_ + fStack_a48 * auVar89._8_4_;
              auVar336._12_4_ =
                   fStack_a34 * auVar116._12_4_ +
                   fStack_a54 * auVar122._12_4_ +
                   fStack_a64 * auVar94._12_4_ + fStack_a44 * auVar89._12_4_;
              auVar116 = vpermilps_avx(ZEXT416((uint)(fVar209 + -1.0)),0);
              auVar157 = vpermilps_avx(ZEXT416((uint)(fVar176 * -9.0 + 4.0)),0);
              auVar94 = ZEXT416((uint)(fVar176 * 9.0 + -5.0));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar89 = ZEXT416((uint)(fVar176 * -3.0 + 2.0));
              auVar122 = vshufps_avx(auVar89,auVar89,0);
              auVar89 = vdpps_avx(auVar336,auVar336,0x7f);
              auVar117._0_4_ =
                   local_a40 * auVar122._0_4_ +
                   local_a60 * auVar94._0_4_ +
                   local_a50 * auVar157._0_4_ + local_a70 * auVar116._0_4_;
              auVar117._4_4_ =
                   fStack_a3c * auVar122._4_4_ +
                   fStack_a5c * auVar94._4_4_ +
                   fStack_a4c * auVar157._4_4_ + fStack_a6c * auVar116._4_4_;
              auVar117._8_4_ =
                   fStack_a38 * auVar122._8_4_ +
                   fStack_a58 * auVar94._8_4_ +
                   fStack_a48 * auVar157._8_4_ + fStack_a68 * auVar116._8_4_;
              auVar117._12_4_ =
                   fStack_a34 * auVar122._12_4_ +
                   fStack_a54 * auVar94._12_4_ +
                   fStack_a44 * auVar157._12_4_ + fStack_a64 * auVar116._12_4_;
              auVar94 = vblendps_avx(auVar89,_DAT_01f7aa10,0xe);
              auVar122 = vrsqrtss_avx(auVar94,auVar94);
              fVar209 = auVar122._0_4_;
              fVar156 = auVar89._0_4_;
              auVar122 = vdpps_avx(auVar336,auVar117,0x7f);
              auVar116 = vshufps_avx(auVar89,auVar89,0);
              auVar118._0_4_ = auVar117._0_4_ * auVar116._0_4_;
              auVar118._4_4_ = auVar117._4_4_ * auVar116._4_4_;
              auVar118._8_4_ = auVar117._8_4_ * auVar116._8_4_;
              auVar118._12_4_ = auVar117._12_4_ * auVar116._12_4_;
              auVar122 = vshufps_avx(auVar122,auVar122,0);
              auVar179._0_4_ = auVar336._0_4_ * auVar122._0_4_;
              auVar179._4_4_ = auVar336._4_4_ * auVar122._4_4_;
              auVar179._8_4_ = auVar336._8_4_ * auVar122._8_4_;
              auVar179._12_4_ = auVar336._12_4_ * auVar122._12_4_;
              auVar157 = vsubps_avx(auVar118,auVar179);
              auVar122 = vrcpss_avx(auVar94,auVar94);
              auVar94 = vmaxss_avx(ZEXT416((uint)local_920),
                                   ZEXT416((uint)(auVar332._0_4_ * (float)local_760._0_4_)));
              auVar122 = ZEXT416((uint)(auVar122._0_4_ * (2.0 - fVar156 * auVar122._0_4_)));
              auVar122 = vshufps_avx(auVar122,auVar122,0);
              uVar78 = CONCAT44(auVar336._4_4_,auVar336._0_4_);
              auVar202._0_8_ = uVar78 ^ 0x8000000080000000;
              auVar202._8_4_ = -auVar336._8_4_;
              auVar202._12_4_ = -auVar336._12_4_;
              auVar116 = ZEXT416((uint)(fVar209 * 1.5 + fVar156 * -0.5 * fVar209 * fVar209 * fVar209
                                       ));
              auVar116 = vshufps_avx(auVar116,auVar116,0);
              auVar160._0_4_ = auVar116._0_4_ * auVar157._0_4_ * auVar122._0_4_;
              auVar160._4_4_ = auVar116._4_4_ * auVar157._4_4_ * auVar122._4_4_;
              auVar160._8_4_ = auVar116._8_4_ * auVar157._8_4_ * auVar122._8_4_;
              auVar160._12_4_ = auVar116._12_4_ * auVar157._12_4_ * auVar122._12_4_;
              auVar223._0_4_ = auVar336._0_4_ * auVar116._0_4_;
              auVar223._4_4_ = auVar336._4_4_ * auVar116._4_4_;
              auVar223._8_4_ = auVar336._8_4_ * auVar116._8_4_;
              auVar223._12_4_ = auVar336._12_4_ * auVar116._12_4_;
              if (fVar156 < 0.0) {
                fVar156 = sqrtf(fVar156);
                auVar346 = ZEXT464(auVar88._0_4_);
              }
              else {
                auVar88 = vsqrtss_avx(auVar89,auVar89);
                fVar156 = auVar88._0_4_;
              }
              auVar88 = vdpps_avx(auVar114,auVar223,0x7f);
              fVar156 = (local_920 / fVar156) * (auVar346._0_4_ + 1.0) +
                        auVar94._0_4_ + auVar346._0_4_ * local_920;
              auVar89 = vdpps_avx(auVar202,auVar223,0x7f);
              auVar122 = vdpps_avx(auVar114,auVar160,0x7f);
              auVar116 = vdpps_avx(_local_950,auVar223,0x7f);
              auVar157 = vdpps_avx(auVar114,auVar202,0x7f);
              fVar209 = auVar89._0_4_ + auVar122._0_4_;
              fVar176 = auVar88._0_4_;
              auVar90._0_4_ = fVar176 * fVar176;
              auVar90._4_4_ = auVar88._4_4_ * auVar88._4_4_;
              auVar90._8_4_ = auVar88._8_4_ * auVar88._8_4_;
              auVar90._12_4_ = auVar88._12_4_ * auVar88._12_4_;
              auVar158 = vsubps_avx(auVar167,auVar90);
              auVar89 = vdpps_avx(auVar114,_local_950,0x7f);
              fVar213 = auVar157._0_4_ - fVar176 * fVar209;
              auVar122 = vrsqrtss_avx(auVar158,auVar158);
              fVar177 = auVar158._0_4_;
              fVar175 = auVar122._0_4_;
              fVar175 = fVar175 * 1.5 + fVar177 * -0.5 * fVar175 * fVar175 * fVar175;
              if (fVar177 < 0.0) {
                local_980._0_4_ = fVar213;
                local_a00._0_4_ = fVar175;
                auVar346 = ZEXT1664(auVar346._0_16_);
                fVar177 = sqrtf(fVar177);
                fVar175 = (float)local_a00._0_4_;
                fVar213 = (float)local_980._0_4_;
              }
              else {
                auVar122 = vsqrtss_avx(auVar158,auVar158);
                fVar177 = auVar122._0_4_;
              }
              auVar157 = vpermilps_avx(_local_9a0,0xff);
              auVar158 = vshufps_avx(auVar336,auVar336,0xff);
              fVar213 = fVar213 * fVar175 - auVar158._0_4_;
              fVar175 = (auVar89._0_4_ - fVar176 * auVar116._0_4_) * fVar175;
              auVar180._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
              auVar180._8_4_ = auVar116._8_4_ ^ 0x80000000;
              auVar180._12_4_ = auVar116._12_4_ ^ 0x80000000;
              auVar203._0_4_ = -fVar213;
              auVar203._4_4_ = 0x80000000;
              auVar203._8_4_ = 0x80000000;
              auVar203._12_4_ = 0x80000000;
              auVar89 = vinsertps_avx(auVar203,ZEXT416((uint)fVar175),0x1c);
              auVar116 = vmovsldup_avx(ZEXT416((uint)(fVar209 * fVar175 - auVar116._0_4_ * fVar213))
                                      );
              auVar89 = vdivps_avx(auVar89,auVar116);
              auVar122 = vinsertps_avx(ZEXT416((uint)fVar209),auVar180,0x10);
              auVar122 = vdivps_avx(auVar122,auVar116);
              auVar116 = vmovsldup_avx(auVar88);
              auVar91 = ZEXT416((uint)(fVar177 - auVar157._0_4_));
              auVar157 = vmovsldup_avx(auVar91);
              auVar143._0_4_ = auVar116._0_4_ * auVar89._0_4_ + auVar157._0_4_ * auVar122._0_4_;
              auVar143._4_4_ = auVar116._4_4_ * auVar89._4_4_ + auVar157._4_4_ * auVar122._4_4_;
              auVar143._8_4_ = auVar116._8_4_ * auVar89._8_4_ + auVar157._8_4_ * auVar122._8_4_;
              auVar143._12_4_ = auVar116._12_4_ * auVar89._12_4_ + auVar157._12_4_ * auVar122._12_4_
              ;
              auVar141 = vsubps_avx(auVar141,auVar143);
              auVar332 = ZEXT1664(auVar141);
              auVar144._8_4_ = 0x7fffffff;
              auVar144._0_8_ = 0x7fffffff7fffffff;
              auVar144._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx(auVar88,auVar144);
              if (auVar88._0_4_ < fVar156) {
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar88 = vandps_avx(auVar91,auVar161);
                if (auVar88._0_4_ < (float)local_7a0._0_4_ * 1.9073486e-06 + auVar94._0_4_ + fVar156
                   ) {
                  fVar156 = auVar141._0_4_ + (float)local_8b0._0_4_;
                  if ((fVar197 <= fVar156) &&
                     (fVar209 = *(float *)(ray + k * 4 + 0x80), fVar156 <= fVar209)) {
                    auVar88 = vmovshdup_avx(auVar141);
                    fVar175 = auVar88._0_4_;
                    if ((0.0 <= fVar175) && (fVar175 <= 1.0)) {
                      auVar167 = vrsqrtss_avx(auVar167,auVar167);
                      fVar176 = auVar167._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar72].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar167 = ZEXT416((uint)(fVar176 * 1.5 +
                                                 fVar211 * -0.5 * fVar176 * fVar176 * fVar176));
                        auVar167 = vshufps_avx(auVar167,auVar167,0);
                        local_b80._0_4_ = auVar114._0_4_;
                        local_b80._4_4_ = auVar114._4_4_;
                        fStack_b78 = auVar114._8_4_;
                        fStack_b74 = auVar114._12_4_;
                        auVar162._0_4_ = auVar167._0_4_ * (float)local_b80._0_4_;
                        auVar162._4_4_ = auVar167._4_4_ * (float)local_b80._4_4_;
                        auVar162._8_4_ = auVar167._8_4_ * fStack_b78;
                        auVar162._12_4_ = auVar167._12_4_ * fStack_b74;
                        auVar119._0_4_ = auVar336._0_4_ + auVar158._0_4_ * auVar162._0_4_;
                        auVar119._4_4_ = auVar336._4_4_ + auVar158._4_4_ * auVar162._4_4_;
                        auVar119._8_4_ = auVar336._8_4_ + auVar158._8_4_ * auVar162._8_4_;
                        auVar119._12_4_ = auVar336._12_4_ + auVar158._12_4_ * auVar162._12_4_;
                        auVar167 = vshufps_avx(auVar162,auVar162,0xc9);
                        auVar114 = vshufps_avx(auVar336,auVar336,0xc9);
                        auVar163._0_4_ = auVar114._0_4_ * auVar162._0_4_;
                        auVar163._4_4_ = auVar114._4_4_ * auVar162._4_4_;
                        auVar163._8_4_ = auVar114._8_4_ * auVar162._8_4_;
                        auVar163._12_4_ = auVar114._12_4_ * auVar162._12_4_;
                        auVar181._0_4_ = auVar336._0_4_ * auVar167._0_4_;
                        auVar181._4_4_ = auVar336._4_4_ * auVar167._4_4_;
                        auVar181._8_4_ = auVar336._8_4_ * auVar167._8_4_;
                        auVar181._12_4_ = auVar336._12_4_ * auVar167._12_4_;
                        auVar88 = vsubps_avx(auVar181,auVar163);
                        auVar167 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar114 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar182._0_4_ = auVar114._0_4_ * auVar167._0_4_;
                        auVar182._4_4_ = auVar114._4_4_ * auVar167._4_4_;
                        auVar182._8_4_ = auVar114._8_4_ * auVar167._8_4_;
                        auVar182._12_4_ = auVar114._12_4_ * auVar167._12_4_;
                        auVar167 = vshufps_avx(auVar88,auVar88,0xd2);
                        auVar120._0_4_ = auVar119._0_4_ * auVar167._0_4_;
                        auVar120._4_4_ = auVar119._4_4_ * auVar167._4_4_;
                        auVar120._8_4_ = auVar119._8_4_ * auVar167._8_4_;
                        auVar120._12_4_ = auVar119._12_4_ * auVar167._12_4_;
                        auVar167 = vsubps_avx(auVar182,auVar120);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar156;
                          uVar1 = vextractps_avx(auVar167,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                          uVar1 = vextractps_avx(auVar167,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                          *(int *)(ray + k * 4 + 0xe0) = auVar167._0_4_;
                          *(float *)(ray + k * 4 + 0xf0) = fVar175;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_900;
                          *(uint *)(ray + k * 4 + 0x120) = uVar72;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_6f0 = vshufps_avx(auVar141,auVar141,0x55);
                          auVar114 = vshufps_avx(auVar167,auVar167,0x55);
                          auStack_710 = vshufps_avx(auVar167,auVar167,0xaa);
                          local_700 = vshufps_avx(auVar167,auVar167,0);
                          local_720 = (RTCHitN  [16])auVar114;
                          local_6e0 = ZEXT816(0) << 0x20;
                          local_6d0 = local_740._0_8_;
                          uStack_6c8 = local_740._8_8_;
                          local_6c0 = local_730._0_8_;
                          uStack_6b8 = local_730._8_8_;
                          uVar75 = context->user->instID[0];
                          _local_6b0 = CONCAT44(uVar75,uVar75);
                          _uStack_6a8 = CONCAT44(uVar75,uVar75);
                          uVar75 = context->user->instPrimID[0];
                          auVar121._4_4_ = uVar75;
                          auVar121._0_4_ = uVar75;
                          auVar121._8_4_ = uVar75;
                          auVar121._12_4_ = uVar75;
                          auStack_6a0 = auVar121;
                          *(float *)(ray + k * 4 + 0x80) = fVar156;
                          local_8e0._0_16_ = *local_9a8;
                          local_a30.valid = (int *)local_8e0;
                          local_a30.geometryUserPtr = pGVar4->userPtr;
                          local_a30.context = context->user;
                          local_a30.hit = local_720;
                          local_a30.N = 4;
                          auVar167 = *local_9a8;
                          local_a30.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar332 = ZEXT1664(auVar141);
                            auVar346 = ZEXT1664(auVar346._0_16_);
                            (*pGVar4->intersectionFilterN)(&local_a30);
                            auVar339._8_56_ = extraout_var_00;
                            auVar339._0_8_ = extraout_XMM1_Qa;
                            auVar121 = auVar339._0_16_;
                            auVar167 = local_8e0._0_16_;
                          }
                          if (auVar167 == (undefined1  [16])0x0) {
                            auVar114 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar167 = vpcmpeqd_avx(auVar121,auVar121);
                            auVar114 = auVar114 ^ auVar167;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            auVar88 = vpcmpeqd_avx(auVar114,auVar114);
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar332 = ZEXT1664(auVar332._0_16_);
                              auVar346 = ZEXT1664(auVar346._0_16_);
                              (*p_Var5)(&local_a30);
                              auVar88 = vpcmpeqd_avx(auVar88,auVar88);
                              auVar167 = local_8e0._0_16_;
                            }
                            auVar94 = vpcmpeqd_avx(auVar167,_DAT_01f7aa10);
                            auVar114 = auVar94 ^ auVar88;
                            if (auVar167 != (undefined1  [16])0x0) {
                              auVar94 = auVar94 ^ auVar88;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])local_a30.hit)
                              ;
                              *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x10));
                              *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x20));
                              *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x30));
                              *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x40));
                              *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x50));
                              *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x60));
                              *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x70));
                              *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar167;
                              auVar167 = vmaskmovps_avx(auVar94,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x80));
                              *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar167;
                            }
                          }
                          auVar92._8_8_ = 0x100000001;
                          auVar92._0_8_ = 0x100000001;
                          if ((auVar92 & auVar114) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar209;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar77 = lVar77 + -1;
            } while (lVar77 != 0);
            auVar100 = local_560;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar106._4_4_ = uVar1;
            auVar106._0_4_ = uVar1;
            auVar106._8_4_ = uVar1;
            auVar106._12_4_ = uVar1;
            auVar106._16_4_ = uVar1;
            auVar106._20_4_ = uVar1;
            auVar106._24_4_ = uVar1;
            auVar106._28_4_ = uVar1;
            auVar99 = vcmpps_avx(_local_940,auVar106,2);
            local_560 = vandps_avx(auVar99,local_560);
            auVar285 = ZEXT3264(local_560);
            auVar100 = auVar100 & auVar99;
            auVar187 = local_7e0._0_28_;
          } while ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar100 >> 0x7f,0) != '\0') ||
                     (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar100 >> 0xbf,0) != '\0') ||
                   (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar100[0x1f] < '\0');
          auVar285 = ZEXT3264(local_320);
          auVar339 = ZEXT3264(_local_820);
          fVar156 = (float)local_660._0_4_;
          fVar209 = (float)local_660._4_4_;
          fVar175 = fStack_658;
          fVar211 = fStack_654;
          fVar176 = fStack_650;
          fVar213 = fStack_64c;
          fVar177 = fStack_648;
          fVar219 = fStack_644;
        }
        auVar134._0_4_ =
             auVar187._0_4_ * (float)local_840._0_4_ +
             (float)local_800._0_4_ * (float)local_860._0_4_ +
             (float)local_7c0._0_4_ * (float)local_880._0_4_;
        auVar134._4_4_ =
             auVar187._4_4_ * (float)local_840._4_4_ +
             (float)local_800._4_4_ * (float)local_860._4_4_ +
             (float)local_7c0._4_4_ * (float)local_880._4_4_;
        auVar134._8_4_ =
             auVar187._8_4_ * fStack_838 + fStack_7f8 * fStack_858 + fStack_7b8 * fStack_878;
        auVar134._12_4_ =
             auVar187._12_4_ * fStack_834 + fStack_7f4 * fStack_854 + fStack_7b4 * fStack_874;
        auVar134._16_4_ =
             auVar187._16_4_ * fStack_830 + fStack_7f0 * fStack_850 + fStack_7b0 * fStack_870;
        auVar134._20_4_ =
             auVar187._20_4_ * fStack_82c + fStack_7ec * fStack_84c + fStack_7ac * fStack_86c;
        auVar134._24_4_ =
             auVar187._24_4_ * fStack_828 + fStack_7e8 * fStack_848 + fStack_7a8 * fStack_868;
        auVar134._28_4_ = fStack_7e4 + fStack_7e4 + auVar285._28_4_;
        auVar151._8_4_ = 0x7fffffff;
        auVar151._0_8_ = 0x7fffffff7fffffff;
        auVar151._12_4_ = 0x7fffffff;
        auVar151._16_4_ = 0x7fffffff;
        auVar151._20_4_ = 0x7fffffff;
        auVar151._24_4_ = 0x7fffffff;
        auVar151._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar134,auVar151);
        auVar152._8_4_ = 0x3e99999a;
        auVar152._0_8_ = 0x3e99999a3e99999a;
        auVar152._12_4_ = 0x3e99999a;
        auVar152._16_4_ = 0x3e99999a;
        auVar152._20_4_ = 0x3e99999a;
        auVar152._24_4_ = 0x3e99999a;
        auVar152._28_4_ = 0x3e99999a;
        auVar99 = vcmpps_avx(auVar99,auVar152,1);
        auVar100 = vorps_avx(auVar99,local_5e0);
        auVar153._0_4_ = (float)local_9e0._0_4_ + fVar156;
        auVar153._4_4_ = (float)local_9e0._4_4_ + fVar209;
        auVar153._8_4_ = fStack_9d8 + fVar175;
        auVar153._12_4_ = fStack_9d4 + fVar211;
        auVar153._16_4_ = fStack_9d0 + fVar176;
        auVar153._20_4_ = fStack_9cc + fVar213;
        auVar153._24_4_ = fStack_9c8 + fVar177;
        auVar153._28_4_ = fStack_9c4 + fVar219;
        auVar99 = vcmpps_avx(auVar153,auVar106,2);
        _local_880 = vandps_avx(auVar99,local_5c0);
        auVar154._8_4_ = 3;
        auVar154._0_8_ = 0x300000003;
        auVar154._12_4_ = 3;
        auVar154._16_4_ = 3;
        auVar154._20_4_ = 3;
        auVar154._24_4_ = 3;
        auVar154._28_4_ = 3;
        auVar174._8_4_ = 2;
        auVar174._0_8_ = 0x200000002;
        auVar174._12_4_ = 2;
        auVar174._16_4_ = 2;
        auVar174._20_4_ = 2;
        auVar174._24_4_ = 2;
        auVar174._28_4_ = 2;
        auVar99 = vblendvps_avx(auVar174,auVar154,auVar100);
        auVar70._4_4_ = fStack_63c;
        auVar70._0_4_ = local_640;
        auVar70._8_4_ = fStack_638;
        auVar70._12_4_ = fStack_634;
        auVar167 = vpcmpgtd_avx(auVar99._16_16_,auVar70);
        auVar114 = vpshufd_avx(local_600._0_16_,0);
        auVar114 = vpcmpgtd_avx(auVar99._0_16_,auVar114);
        auVar155._16_16_ = auVar167;
        auVar155._0_16_ = auVar106._0_16_;
        _local_860 = vblendps_avx(ZEXT1632(auVar114),auVar155,0xf0);
        auVar99 = vandnps_avx(_local_860,_local_880);
        auVar100 = _local_880 & ~_local_860;
        local_8e0 = auVar99;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          local_840._4_4_ = (float)local_9e0._4_4_ + local_320._4_4_;
          local_840._0_4_ = (float)local_9e0._0_4_ + local_320._0_4_;
          fStack_838 = fStack_9d8 + local_320._8_4_;
          fStack_834 = fStack_9d4 + local_320._12_4_;
          fStack_830 = fStack_9d0 + local_320._16_4_;
          fStack_82c = fStack_9cc + local_320._20_4_;
          fStack_828 = fStack_9c8 + local_320._24_4_;
          fStack_824 = fStack_9c4 + local_320._28_4_;
          _local_940 = local_320;
          do {
            auVar108._8_4_ = 0x7f800000;
            auVar108._0_8_ = 0x7f8000007f800000;
            auVar108._12_4_ = 0x7f800000;
            auVar108._16_4_ = 0x7f800000;
            auVar108._20_4_ = 0x7f800000;
            auVar108._24_4_ = 0x7f800000;
            auVar108._28_4_ = 0x7f800000;
            auVar100 = vblendvps_avx(auVar108,_local_940,auVar99);
            auVar15 = vshufps_avx(auVar100,auVar100,0xb1);
            auVar15 = vminps_avx(auVar100,auVar15);
            auVar13 = vshufpd_avx(auVar15,auVar15,5);
            auVar15 = vminps_avx(auVar15,auVar13);
            auVar13 = vperm2f128_avx(auVar15,auVar15,1);
            auVar15 = vminps_avx(auVar15,auVar13);
            auVar15 = vcmpps_avx(auVar100,auVar15,0);
            auVar13 = auVar99 & auVar15;
            auVar100 = auVar99;
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0x7f,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0xbf,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar13[0x1f] < '\0') {
              auVar100 = vandps_avx(auVar15,auVar99);
            }
            uVar73 = vmovmskps_avx(auVar100);
            uVar75 = 0;
            if (uVar73 != 0) {
              for (; (uVar73 >> uVar75 & 1) == 0; uVar75 = uVar75 + 1) {
              }
            }
            uVar78 = (ulong)uVar75;
            local_8e0 = auVar99;
            *(undefined4 *)(local_8e0 + uVar78 * 4) = 0;
            fVar156 = local_1c0[uVar78];
            uVar75 = *(uint *)(local_300 + uVar78 * 4);
            fVar209 = auVar10._0_4_;
            if ((float)local_960._0_4_ < 0.0) {
              fVar209 = sqrtf((float)local_960._0_4_);
            }
            auVar114 = vminps_avx(auVar11,auVar83);
            auVar167 = vmaxps_avx(auVar11,auVar83);
            auVar88 = vminps_avx(auVar12,auVar84);
            auVar94 = vminps_avx(auVar114,auVar88);
            auVar114 = vmaxps_avx(auVar12,auVar84);
            auVar88 = vmaxps_avx(auVar167,auVar114);
            auVar164._8_4_ = 0x7fffffff;
            auVar164._0_8_ = 0x7fffffff7fffffff;
            auVar164._12_4_ = 0x7fffffff;
            auVar167 = vandps_avx(auVar94,auVar164);
            auVar114 = vandps_avx(auVar88,auVar164);
            auVar167 = vmaxps_avx(auVar167,auVar114);
            auVar114 = vmovshdup_avx(auVar167);
            auVar114 = vmaxss_avx(auVar114,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar114);
            local_920 = auVar167._0_4_ * 1.9073486e-06;
            local_760._0_4_ = fVar209 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar88,auVar88,0xff);
            auVar167 = vinsertps_avx(ZEXT416(uVar75),ZEXT416((uint)fVar156),0x10);
            auVar332 = ZEXT1664(auVar167);
            lVar77 = 5;
            do {
              auVar141 = auVar332._0_16_;
              auVar167 = vshufps_avx(auVar141,auVar141,0);
              auVar93._0_4_ = auVar167._0_4_ * (float)local_950._0_4_ + 0.0;
              auVar93._4_4_ = auVar167._4_4_ * (float)local_950._4_4_ + 0.0;
              auVar93._8_4_ = auVar167._8_4_ * fStack_948 + 0.0;
              auVar93._12_4_ = auVar167._12_4_ * fStack_944 + 0.0;
              auVar167 = vmovshdup_avx(auVar141);
              fVar176 = auVar167._0_4_;
              fVar175 = 1.0 - fVar176;
              fVar209 = fVar176 * 3.0;
              fVar156 = fVar209 + -5.0;
              auVar167 = ZEXT416((uint)(fVar176 * fVar176 * -fVar175 * 0.5));
              auVar167 = vshufps_avx(auVar167,auVar167,0);
              auVar114 = ZEXT416((uint)((fVar175 * fVar175 * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar88 = ZEXT416((uint)((fVar176 * fVar176 * fVar156 + 2.0) * 0.5));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar94 = ZEXT416((uint)(fVar175 * fVar175 * -fVar176 * 0.5));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar145._0_4_ =
                   auVar94._0_4_ * local_a40 +
                   auVar88._0_4_ * local_a60 +
                   auVar114._0_4_ * local_a50 + auVar167._0_4_ * local_a70;
              auVar145._4_4_ =
                   auVar94._4_4_ * fStack_a3c +
                   auVar88._4_4_ * fStack_a5c +
                   auVar114._4_4_ * fStack_a4c + auVar167._4_4_ * fStack_a6c;
              auVar145._8_4_ =
                   auVar94._8_4_ * fStack_a38 +
                   auVar88._8_4_ * fStack_a58 +
                   auVar114._8_4_ * fStack_a48 + auVar167._8_4_ * fStack_a68;
              auVar145._12_4_ =
                   auVar94._12_4_ * fStack_a34 +
                   auVar88._12_4_ * fStack_a54 +
                   auVar114._12_4_ * fStack_a44 + auVar167._12_4_ * fStack_a64;
              _local_9a0 = auVar145;
              auVar114 = vsubps_avx(auVar93,auVar145);
              auVar167 = vdpps_avx(auVar114,auVar114,0x7f);
              fVar211 = auVar167._0_4_;
              if (fVar211 < 0.0) {
                local_980._0_4_ = fVar209;
                local_a00._0_4_ = fVar156;
                local_780._0_4_ = fVar175 * -2.0;
                fVar213 = sqrtf(fVar211);
                fVar156 = (float)local_a00._0_4_;
                fVar177 = (float)local_780._0_4_;
                fVar219 = (float)local_980._0_4_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar167,auVar167);
                fVar213 = auVar88._0_4_;
                fVar177 = fVar175 * -2.0;
                fVar219 = fVar209;
              }
              auVar88 = ZEXT416((uint)((fVar176 * fVar176 + fVar176 * fVar177) * 0.5));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar94 = ZEXT416((uint)(((fVar175 + fVar175) * (fVar219 + 2.0) +
                                       fVar175 * fVar175 * -3.0) * 0.5));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar89 = ZEXT416((uint)((fVar156 * (fVar176 + fVar176) + fVar176 * fVar219) * 0.5));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar122 = ZEXT416((uint)((fVar176 * (fVar175 + fVar175) - fVar175 * fVar175) * 0.5));
              auVar122 = vshufps_avx(auVar122,auVar122,0);
              auVar337._0_4_ =
                   local_a40 * auVar122._0_4_ +
                   local_a60 * auVar89._0_4_ + local_a70 * auVar88._0_4_ + local_a50 * auVar94._0_4_
              ;
              auVar337._4_4_ =
                   fStack_a3c * auVar122._4_4_ +
                   fStack_a5c * auVar89._4_4_ +
                   fStack_a6c * auVar88._4_4_ + fStack_a4c * auVar94._4_4_;
              auVar337._8_4_ =
                   fStack_a38 * auVar122._8_4_ +
                   fStack_a58 * auVar89._8_4_ +
                   fStack_a68 * auVar88._8_4_ + fStack_a48 * auVar94._8_4_;
              auVar337._12_4_ =
                   fStack_a34 * auVar122._12_4_ +
                   fStack_a54 * auVar89._12_4_ +
                   fStack_a64 * auVar88._12_4_ + fStack_a44 * auVar94._12_4_;
              auVar122 = vpermilps_avx(ZEXT416((uint)(fVar209 + -1.0)),0);
              auVar116 = vpermilps_avx(ZEXT416((uint)(fVar176 * -9.0 + 4.0)),0);
              auVar88 = ZEXT416((uint)(fVar176 * 9.0 + -5.0));
              auVar88 = vshufps_avx(auVar88,auVar88,0);
              auVar94 = ZEXT416((uint)(fVar176 * -3.0 + 2.0));
              auVar89 = vshufps_avx(auVar94,auVar94,0);
              auVar94 = vdpps_avx(auVar337,auVar337,0x7f);
              auVar123._0_4_ =
                   local_a40 * auVar89._0_4_ +
                   local_a60 * auVar88._0_4_ +
                   local_a50 * auVar116._0_4_ + local_a70 * auVar122._0_4_;
              auVar123._4_4_ =
                   fStack_a3c * auVar89._4_4_ +
                   fStack_a5c * auVar88._4_4_ +
                   fStack_a4c * auVar116._4_4_ + fStack_a6c * auVar122._4_4_;
              auVar123._8_4_ =
                   fStack_a38 * auVar89._8_4_ +
                   fStack_a58 * auVar88._8_4_ +
                   fStack_a48 * auVar116._8_4_ + fStack_a68 * auVar122._8_4_;
              auVar123._12_4_ =
                   fStack_a34 * auVar89._12_4_ +
                   fStack_a54 * auVar88._12_4_ +
                   fStack_a44 * auVar116._12_4_ + fStack_a64 * auVar122._12_4_;
              auVar88 = vblendps_avx(auVar94,_DAT_01f7aa10,0xe);
              auVar89 = vrsqrtss_avx(auVar88,auVar88);
              fVar209 = auVar89._0_4_;
              fVar156 = auVar94._0_4_;
              auVar89 = vdpps_avx(auVar337,auVar123,0x7f);
              auVar122 = vshufps_avx(auVar94,auVar94,0);
              auVar124._0_4_ = auVar123._0_4_ * auVar122._0_4_;
              auVar124._4_4_ = auVar123._4_4_ * auVar122._4_4_;
              auVar124._8_4_ = auVar123._8_4_ * auVar122._8_4_;
              auVar124._12_4_ = auVar123._12_4_ * auVar122._12_4_;
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              auVar183._0_4_ = auVar337._0_4_ * auVar89._0_4_;
              auVar183._4_4_ = auVar337._4_4_ * auVar89._4_4_;
              auVar183._8_4_ = auVar337._8_4_ * auVar89._8_4_;
              auVar183._12_4_ = auVar337._12_4_ * auVar89._12_4_;
              auVar116 = vsubps_avx(auVar124,auVar183);
              auVar89 = vrcpss_avx(auVar88,auVar88);
              auVar88 = vmaxss_avx(ZEXT416((uint)local_920),
                                   ZEXT416((uint)(auVar332._0_4_ * (float)local_760._0_4_)));
              auVar89 = ZEXT416((uint)(auVar89._0_4_ * (2.0 - fVar156 * auVar89._0_4_)));
              auVar89 = vshufps_avx(auVar89,auVar89,0);
              uVar78 = CONCAT44(auVar337._4_4_,auVar337._0_4_);
              auVar204._0_8_ = uVar78 ^ 0x8000000080000000;
              auVar204._8_4_ = -auVar337._8_4_;
              auVar204._12_4_ = -auVar337._12_4_;
              auVar122 = ZEXT416((uint)(fVar209 * 1.5 + fVar156 * -0.5 * fVar209 * fVar209 * fVar209
                                       ));
              auVar122 = vshufps_avx(auVar122,auVar122,0);
              auVar165._0_4_ = auVar122._0_4_ * auVar116._0_4_ * auVar89._0_4_;
              auVar165._4_4_ = auVar122._4_4_ * auVar116._4_4_ * auVar89._4_4_;
              auVar165._8_4_ = auVar122._8_4_ * auVar116._8_4_ * auVar89._8_4_;
              auVar165._12_4_ = auVar122._12_4_ * auVar116._12_4_ * auVar89._12_4_;
              auVar224._0_4_ = auVar337._0_4_ * auVar122._0_4_;
              auVar224._4_4_ = auVar337._4_4_ * auVar122._4_4_;
              auVar224._8_4_ = auVar337._8_4_ * auVar122._8_4_;
              auVar224._12_4_ = auVar337._12_4_ * auVar122._12_4_;
              if (fVar156 < 0.0) {
                fVar156 = sqrtf(fVar156);
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
                fVar156 = auVar94._0_4_;
              }
              auVar94 = vdpps_avx(auVar114,auVar224,0x7f);
              fVar156 = (local_920 / fVar156) * (fVar213 + 1.0) +
                        auVar88._0_4_ + fVar213 * local_920;
              auVar89 = vdpps_avx(auVar204,auVar224,0x7f);
              auVar122 = vdpps_avx(auVar114,auVar165,0x7f);
              auVar116 = vdpps_avx(_local_950,auVar224,0x7f);
              auVar157 = vdpps_avx(auVar114,auVar204,0x7f);
              fVar209 = auVar89._0_4_ + auVar122._0_4_;
              fVar176 = auVar94._0_4_;
              auVar95._0_4_ = fVar176 * fVar176;
              auVar95._4_4_ = auVar94._4_4_ * auVar94._4_4_;
              auVar95._8_4_ = auVar94._8_4_ * auVar94._8_4_;
              auVar95._12_4_ = auVar94._12_4_ * auVar94._12_4_;
              auVar158 = vsubps_avx(auVar167,auVar95);
              auVar91 = ZEXT416((uint)fVar209);
              auVar89 = vdpps_avx(auVar114,_local_950,0x7f);
              fVar213 = auVar157._0_4_ - fVar176 * fVar209;
              auVar122 = vrsqrtss_avx(auVar158,auVar158);
              fVar177 = auVar158._0_4_;
              fVar175 = auVar122._0_4_;
              fVar175 = fVar175 * 1.5 + fVar177 * -0.5 * fVar175 * fVar175 * fVar175;
              if (fVar177 < 0.0) {
                local_980._0_4_ = fVar213;
                local_a00._0_4_ = fVar175;
                fVar177 = sqrtf(fVar177);
                fVar175 = (float)local_a00._0_4_;
                fVar213 = (float)local_980._0_4_;
              }
              else {
                auVar122 = vsqrtss_avx(auVar158,auVar158);
                fVar177 = auVar122._0_4_;
              }
              auVar157 = vpermilps_avx(_local_9a0,0xff);
              auVar158 = vshufps_avx(auVar337,auVar337,0xff);
              fVar213 = fVar213 * fVar175 - auVar158._0_4_;
              fVar175 = (auVar89._0_4_ - fVar176 * auVar116._0_4_) * fVar175;
              auVar184._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
              auVar184._8_4_ = auVar116._8_4_ ^ 0x80000000;
              auVar184._12_4_ = auVar116._12_4_ ^ 0x80000000;
              auVar205._0_4_ = -fVar213;
              auVar205._4_4_ = 0x80000000;
              auVar205._8_4_ = 0x80000000;
              auVar205._12_4_ = 0x80000000;
              auVar346 = ZEXT1664(auVar91);
              auVar89 = vinsertps_avx(auVar205,ZEXT416((uint)fVar175),0x1c);
              auVar116 = vmovsldup_avx(ZEXT416((uint)(fVar209 * fVar175 - auVar116._0_4_ * fVar213))
                                      );
              auVar89 = vdivps_avx(auVar89,auVar116);
              auVar122 = vinsertps_avx(auVar91,auVar184,0x10);
              auVar122 = vdivps_avx(auVar122,auVar116);
              auVar116 = vmovsldup_avx(auVar94);
              auVar96 = ZEXT416((uint)(fVar177 - auVar157._0_4_));
              auVar157 = vmovsldup_avx(auVar96);
              auVar146._0_4_ = auVar116._0_4_ * auVar89._0_4_ + auVar157._0_4_ * auVar122._0_4_;
              auVar146._4_4_ = auVar116._4_4_ * auVar89._4_4_ + auVar157._4_4_ * auVar122._4_4_;
              auVar146._8_4_ = auVar116._8_4_ * auVar89._8_4_ + auVar157._8_4_ * auVar122._8_4_;
              auVar146._12_4_ = auVar116._12_4_ * auVar89._12_4_ + auVar157._12_4_ * auVar122._12_4_
              ;
              auVar141 = vsubps_avx(auVar141,auVar146);
              auVar332 = ZEXT1664(auVar141);
              auVar147._8_4_ = 0x7fffffff;
              auVar147._0_8_ = 0x7fffffff7fffffff;
              auVar147._12_4_ = 0x7fffffff;
              auVar94 = vandps_avx(auVar94,auVar147);
              if (auVar94._0_4_ < fVar156) {
                auVar166._8_4_ = 0x7fffffff;
                auVar166._0_8_ = 0x7fffffff7fffffff;
                auVar166._12_4_ = 0x7fffffff;
                auVar94 = vandps_avx(auVar96,auVar166);
                if (auVar94._0_4_ < (float)local_7a0._0_4_ * 1.9073486e-06 + auVar88._0_4_ + fVar156
                   ) {
                  fVar156 = auVar141._0_4_ + (float)local_8b0._0_4_;
                  if ((fVar197 <= fVar156) &&
                     (fVar209 = *(float *)(ray + k * 4 + 0x80), fVar156 <= fVar209)) {
                    auVar88 = vmovshdup_avx(auVar141);
                    fVar175 = auVar88._0_4_;
                    if ((0.0 <= fVar175) && (fVar175 <= 1.0)) {
                      auVar167 = vrsqrtss_avx(auVar167,auVar167);
                      fVar176 = auVar167._0_4_;
                      pGVar4 = (context->scene->geometries).items[uVar72].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar167 = ZEXT416((uint)(fVar176 * 1.5 +
                                                 fVar211 * -0.5 * fVar176 * fVar176 * fVar176));
                        auVar167 = vshufps_avx(auVar167,auVar167,0);
                        local_b80._0_4_ = auVar114._0_4_;
                        local_b80._4_4_ = auVar114._4_4_;
                        fStack_b78 = auVar114._8_4_;
                        fStack_b74 = auVar114._12_4_;
                        auVar168._0_4_ = auVar167._0_4_ * (float)local_b80._0_4_;
                        auVar168._4_4_ = auVar167._4_4_ * (float)local_b80._4_4_;
                        auVar168._8_4_ = auVar167._8_4_ * fStack_b78;
                        auVar168._12_4_ = auVar167._12_4_ * fStack_b74;
                        auVar125._0_4_ = auVar337._0_4_ + auVar158._0_4_ * auVar168._0_4_;
                        auVar125._4_4_ = auVar337._4_4_ + auVar158._4_4_ * auVar168._4_4_;
                        auVar125._8_4_ = auVar337._8_4_ + auVar158._8_4_ * auVar168._8_4_;
                        auVar125._12_4_ = auVar337._12_4_ + auVar158._12_4_ * auVar168._12_4_;
                        auVar167 = vshufps_avx(auVar168,auVar168,0xc9);
                        auVar114 = vshufps_avx(auVar337,auVar337,0xc9);
                        auVar169._0_4_ = auVar114._0_4_ * auVar168._0_4_;
                        auVar169._4_4_ = auVar114._4_4_ * auVar168._4_4_;
                        auVar169._8_4_ = auVar114._8_4_ * auVar168._8_4_;
                        auVar169._12_4_ = auVar114._12_4_ * auVar168._12_4_;
                        auVar185._0_4_ = auVar337._0_4_ * auVar167._0_4_;
                        auVar185._4_4_ = auVar337._4_4_ * auVar167._4_4_;
                        auVar185._8_4_ = auVar337._8_4_ * auVar167._8_4_;
                        auVar185._12_4_ = auVar337._12_4_ * auVar167._12_4_;
                        auVar88 = vsubps_avx(auVar185,auVar169);
                        auVar167 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar114 = vshufps_avx(auVar125,auVar125,0xc9);
                        auVar186._0_4_ = auVar114._0_4_ * auVar167._0_4_;
                        auVar186._4_4_ = auVar114._4_4_ * auVar167._4_4_;
                        auVar186._8_4_ = auVar114._8_4_ * auVar167._8_4_;
                        auVar186._12_4_ = auVar114._12_4_ * auVar167._12_4_;
                        auVar167 = vshufps_avx(auVar88,auVar88,0xd2);
                        auVar126._0_4_ = auVar125._0_4_ * auVar167._0_4_;
                        auVar126._4_4_ = auVar125._4_4_ * auVar167._4_4_;
                        auVar126._8_4_ = auVar125._8_4_ * auVar167._8_4_;
                        auVar126._12_4_ = auVar125._12_4_ * auVar167._12_4_;
                        auVar167 = vsubps_avx(auVar186,auVar126);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar156;
                          uVar1 = vextractps_avx(auVar167,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                          uVar1 = vextractps_avx(auVar167,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                          *(int *)(ray + k * 4 + 0xe0) = auVar167._0_4_;
                          *(float *)(ray + k * 4 + 0xf0) = fVar175;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_900;
                          *(uint *)(ray + k * 4 + 0x120) = uVar72;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_6f0 = vshufps_avx(auVar141,auVar141,0x55);
                          auVar114 = vshufps_avx(auVar167,auVar167,0x55);
                          auStack_710 = vshufps_avx(auVar167,auVar167,0xaa);
                          local_700 = vshufps_avx(auVar167,auVar167,0);
                          local_720 = (RTCHitN  [16])auVar114;
                          local_6e0 = ZEXT816(0) << 0x20;
                          local_6d0 = local_740._0_8_;
                          uStack_6c8 = local_740._8_8_;
                          local_6c0 = local_730._0_8_;
                          uStack_6b8 = local_730._8_8_;
                          uVar75 = context->user->instID[0];
                          _local_6b0 = CONCAT44(uVar75,uVar75);
                          _uStack_6a8 = CONCAT44(uVar75,uVar75);
                          uVar75 = context->user->instPrimID[0];
                          auVar127._4_4_ = uVar75;
                          auVar127._0_4_ = uVar75;
                          auVar127._8_4_ = uVar75;
                          auVar127._12_4_ = uVar75;
                          auStack_6a0 = auVar127;
                          *(float *)(ray + k * 4 + 0x80) = fVar156;
                          local_8a0 = *local_9a8;
                          local_a30.valid = (int *)local_8a0;
                          local_a30.geometryUserPtr = pGVar4->userPtr;
                          local_a30.context = context->user;
                          local_a30.hit = local_720;
                          local_a30.N = 4;
                          local_a30.ray = (RTCRayN *)ray;
                          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar332 = ZEXT1664(auVar141);
                            auVar346 = ZEXT1664(auVar91);
                            (*pGVar4->intersectionFilterN)(&local_a30);
                            auVar136._8_56_ = extraout_var_01;
                            auVar136._0_8_ = extraout_XMM1_Qa_00;
                            auVar127 = auVar136._0_16_;
                          }
                          if (local_8a0 == (undefined1  [16])0x0) {
                            auVar167 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar114 = vpcmpeqd_avx(auVar127,auVar127);
                            auVar167 = auVar167 ^ auVar114;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            auVar114 = vpcmpeqd_avx(auVar114,auVar114);
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar332 = ZEXT1664(auVar332._0_16_);
                              auVar346 = ZEXT1664(auVar346._0_16_);
                              (*p_Var5)(&local_a30);
                              auVar114 = vpcmpeqd_avx(auVar114,auVar114);
                            }
                            auVar88 = vpcmpeqd_avx(local_8a0,_DAT_01f7aa10);
                            auVar167 = auVar88 ^ auVar114;
                            if (local_8a0 != (undefined1  [16])0x0) {
                              auVar88 = auVar88 ^ auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])local_a30.hit)
                              ;
                              *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x10));
                              *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x20));
                              *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x30));
                              *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x40));
                              *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x50));
                              *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x60));
                              *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x70));
                              *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar114;
                              auVar114 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                                 (local_a30.hit + 0x80));
                              *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar114;
                            }
                          }
                          auVar97._8_8_ = 0x100000001;
                          auVar97._0_8_ = 0x100000001;
                          if ((auVar97 & auVar167) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar209;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar77 = lVar77 + -1;
            } while (lVar77 != 0);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar106._4_4_ = uVar1;
            auVar106._0_4_ = uVar1;
            auVar106._8_4_ = uVar1;
            auVar106._12_4_ = uVar1;
            auVar106._16_4_ = uVar1;
            auVar106._20_4_ = uVar1;
            auVar106._24_4_ = uVar1;
            auVar106._28_4_ = uVar1;
            auVar100 = vcmpps_avx(_local_840,auVar106,2);
            auVar99 = vandps_avx(auVar100,local_8e0);
            auVar100 = local_8e0 & auVar100;
          } while ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar100 >> 0x7f,0) != '\0') ||
                     (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar100 >> 0xbf,0) != '\0') ||
                   (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar100[0x1f] < '\0');
          auVar339 = ZEXT3264(_local_820);
          local_8e0 = auVar99;
        }
        auVar285 = ZEXT3264(local_320);
        auVar99 = vandps_avx(_local_5a0,local_580);
        auVar100 = vandps_avx(_local_880,_local_860);
        auVar191._0_4_ = (float)local_9e0._0_4_ + local_360._0_4_;
        auVar191._4_4_ = (float)local_9e0._4_4_ + local_360._4_4_;
        auVar191._8_4_ = fStack_9d8 + local_360._8_4_;
        auVar191._12_4_ = fStack_9d4 + local_360._12_4_;
        auVar191._16_4_ = fStack_9d0 + local_360._16_4_;
        auVar191._20_4_ = fStack_9cc + local_360._20_4_;
        auVar191._24_4_ = fStack_9c8 + local_360._24_4_;
        auVar191._28_4_ = fStack_9c4 + local_360._28_4_;
        auVar15 = vcmpps_avx(auVar191,auVar106,2);
        auVar99 = vandps_avx(auVar15,auVar99);
        auVar192._0_4_ = local_320._0_4_ + (float)local_9e0._0_4_;
        auVar192._4_4_ = local_320._4_4_ + (float)local_9e0._4_4_;
        auVar192._8_4_ = local_320._8_4_ + fStack_9d8;
        auVar192._12_4_ = local_320._12_4_ + fStack_9d4;
        auVar192._16_4_ = local_320._16_4_ + fStack_9d0;
        auVar192._20_4_ = local_320._20_4_ + fStack_9cc;
        auVar192._24_4_ = local_320._24_4_ + fStack_9c8;
        auVar192._28_4_ = local_320._28_4_ + fStack_9c4;
        auVar15 = vcmpps_avx(auVar192,auVar106,2);
        auVar100 = vandps_avx(auVar15,auVar100);
        auVar100 = vorps_avx(auVar99,auVar100);
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar100;
          auVar99 = vblendvps_avx(local_320,_local_360,auVar99);
          *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x60) = auVar99;
          uVar2 = vmovlps_avx(local_510);
          (&uStack_140)[uVar81 * 0xc] = uVar2;
          aiStack_138[uVar81 * 0x18] = local_c28 + 1;
          iVar80 = iVar80 + 1;
        }
        goto LAB_00e74bb7;
      }
    }
    if (iVar80 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar103._4_4_ = uVar1;
    auVar103._0_4_ = uVar1;
    auVar103._8_4_ = uVar1;
    auVar103._12_4_ = uVar1;
    auVar103._16_4_ = uVar1;
    auVar103._20_4_ = uVar1;
    auVar103._24_4_ = uVar1;
    auVar103._28_4_ = uVar1;
    uVar75 = -iVar80;
    pauVar74 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar80 - 1) * 0x60);
    fVar156 = (float)local_9e0._0_4_;
    fVar209 = (float)local_9e0._4_4_;
    fVar175 = fStack_9d8;
    fVar211 = fStack_9d4;
    fVar176 = fStack_9d0;
    fVar213 = fStack_9cc;
    fVar177 = fStack_9c8;
    fVar219 = fStack_9c4;
    while( true ) {
      auVar99 = pauVar74[1];
      auVar128._0_4_ = fVar156 + auVar99._0_4_;
      auVar128._4_4_ = fVar209 + auVar99._4_4_;
      auVar128._8_4_ = fVar175 + auVar99._8_4_;
      auVar128._12_4_ = fVar211 + auVar99._12_4_;
      auVar128._16_4_ = fVar176 + auVar99._16_4_;
      auVar128._20_4_ = fVar213 + auVar99._20_4_;
      auVar128._24_4_ = fVar177 + auVar99._24_4_;
      auVar128._28_4_ = fVar219 + auVar99._28_4_;
      auVar15 = vcmpps_avx(auVar128,auVar103,2);
      auVar100 = vandps_avx(auVar15,*pauVar74);
      _local_720 = auVar100;
      auVar15 = *pauVar74 & auVar15;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') break;
      pauVar74 = pauVar74 + -3;
      uVar75 = uVar75 + 1;
      fVar156 = (float)local_9e0._0_4_;
      fVar209 = (float)local_9e0._4_4_;
      fVar175 = fStack_9d8;
      fVar211 = fStack_9d4;
      fVar176 = fStack_9d0;
      fVar213 = fStack_9cc;
      fVar177 = fStack_9c8;
      fVar219 = fStack_9c4;
      if (uVar75 == 0) goto LAB_00e76cbb;
    }
    auVar104._8_4_ = 0x7f800000;
    auVar104._0_8_ = 0x7f8000007f800000;
    auVar104._12_4_ = 0x7f800000;
    auVar104._16_4_ = 0x7f800000;
    auVar104._20_4_ = 0x7f800000;
    auVar104._24_4_ = 0x7f800000;
    auVar104._28_4_ = 0x7f800000;
    auVar99 = vblendvps_avx(auVar104,auVar99,auVar100);
    auVar15 = vshufps_avx(auVar99,auVar99,0xb1);
    auVar15 = vminps_avx(auVar99,auVar15);
    auVar13 = vshufpd_avx(auVar15,auVar15,5);
    auVar15 = vminps_avx(auVar15,auVar13);
    auVar13 = vperm2f128_avx(auVar15,auVar15,1);
    auVar15 = vminps_avx(auVar15,auVar13);
    auVar99 = vcmpps_avx(auVar99,auVar15,0);
    auVar15 = auVar100 & auVar99;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar100 = vandps_avx(auVar99,auVar100);
    }
    auVar86._8_8_ = 0;
    auVar86._0_8_ = *(ulong *)pauVar74[2];
    local_c28 = *(uint *)(pauVar74[2] + 8);
    uVar76 = vmovmskps_avx(auVar100);
    uVar73 = 0;
    if (uVar76 != 0) {
      for (; (uVar76 >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
      }
    }
    *(undefined4 *)(local_720 + (ulong)uVar73 * 4) = 0;
    *pauVar74 = _local_720;
    uVar76 = ~uVar75;
    if ((((((((_local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_720 >> 0x7f,0) != '\0') ||
          (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_720 >> 0xbf,0) != '\0') ||
        (_local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_720[0x1f] < '\0') {
      uVar76 = -uVar75;
    }
    uVar81 = (ulong)uVar76;
    auVar167 = vshufps_avx(auVar86,auVar86,0);
    auVar114 = vshufps_avx(auVar86,auVar86,0x55);
    auVar114 = vsubps_avx(auVar114,auVar167);
    local_360._4_4_ = auVar167._4_4_ + auVar114._4_4_ * 0.14285715;
    local_360._0_4_ = auVar167._0_4_ + auVar114._0_4_ * 0.0;
    fStack_358 = auVar167._8_4_ + auVar114._8_4_ * 0.2857143;
    fStack_354 = auVar167._12_4_ + auVar114._12_4_ * 0.42857146;
    fStack_350 = auVar167._0_4_ + auVar114._0_4_ * 0.5714286;
    fStack_34c = auVar167._4_4_ + auVar114._4_4_ * 0.71428573;
    fStack_348 = auVar167._8_4_ + auVar114._8_4_ * 0.8571429;
    fStack_344 = auVar167._12_4_ + auVar114._12_4_;
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_360 + (ulong)uVar73 * 4);
  } while( true );
LAB_00e76cbb:
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar1;
  auVar98._0_4_ = uVar1;
  auVar98._8_4_ = uVar1;
  auVar98._12_4_ = uVar1;
  auVar8 = vcmpps_avx(local_520,auVar98,2);
  uVar72 = vmovmskps_avx(auVar8);
  uVar72 = (uint)uVar79 & uVar72;
  if (uVar72 == 0) {
    return;
  }
  goto LAB_00e73de1;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }